

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::compileInterface
          (NodeTranslator *this,Reader decl,Reader members,Builder builder)

{
  byte *pbVar1;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> **ppRVar2;
  ushort uVar3;
  AuxNode *pAVar4;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar5;
  Arena *pAVar6;
  BrandedDecl *pBVar7;
  ErrorReporter *errorReporter;
  SegmentReader *pSVar8;
  ChunkHeader *pCVar9;
  void *pvVar10;
  Builder target;
  Builder target_00;
  Builder builder_00;
  Builder target_01;
  Builder target_02;
  Builder builder_01;
  Builder target_03;
  Reader source;
  Reader ordinal;
  Reader source_00;
  Reader params_00;
  Reader source_01;
  undefined1 auVar11 [40];
  Reader source_02;
  Reader params_01;
  Reader source_03;
  Reader annotations;
  ImplicitParams implicitMethodParams;
  Reader name;
  Reader name_00;
  undefined1 auVar12 [56];
  undefined1 auVar13 [56];
  Reader *pRVar14;
  ListElementCount LVar15;
  CapTableBuilder *pCVar16;
  BrandScope **ppBVar17;
  RemoveConst<capnp::compiler::BrandScope_*> *ppBVar18;
  BrandScope **ppBVar19;
  MemberInfo **ppMVar20;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar21;
  MemberInfo **ppMVar22;
  undefined8 uVar23;
  long *plVar24;
  MemberInfo ***pppMVar25;
  undefined8 *puVar26;
  WirePointer **ppWVar27;
  size_t *psVar28;
  _Rb_tree_node_base *p_Var29;
  StructDataBitCount SVar30;
  short sVar31;
  PointerType PVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  int iVar35;
  int iVar36;
  _Base_ptr *pp_Var37;
  _Base_ptr p_Var38;
  _func_int **pp_Var39;
  _Base_ptr p_Var40;
  _Base_ptr p_Var41;
  uint uVar42;
  uint32_t uVar43;
  undefined4 uVar44;
  long lVar45;
  ArrayPtr<const_char> *pAVar46;
  SegmentBuilder *pSVar47;
  CapTableReader *pCVar48;
  SegmentBuilder *pSVar49;
  _Base_ptr p_Var50;
  undefined4 uVar51;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar52;
  WirePointer *pWVar53;
  BrandScope *pBVar54;
  uint uVar55;
  Reader *__range2;
  SegmentBuilder *pSVar56;
  SegmentBuilder *pSVar57;
  ulong uVar58;
  ErrorReporter *pEVar59;
  int iVar60;
  size_t sVar61;
  undefined1 auVar62 [8];
  char *pcVar63;
  SegmentBuilder *in_R8;
  SegmentBuilder *pSVar64;
  SegmentBuilder *pSVar65;
  undefined8 uVar66;
  uint uVar67;
  ulong uVar68;
  NodeTranslator *this_00;
  ulong uVar69;
  short *psVar70;
  unsigned_long i;
  ulong uVar71;
  ElementCount EVar72;
  bool bVar73;
  Reader value;
  Reader RVar74;
  StringPtr targetsFlagName;
  ArrayBuilder<capnp::compiler::BrandedDecl> implicitDecls;
  Reader superclass;
  Builder scope_1;
  Vector<capnp::compiler::BrandScope_*> levels_2;
  Vector<capnp::compiler::BrandScope_*> levels_1;
  Builder bindings_1;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> brand;
  BuilderFor<capnp::schema::Node> builder_1;
  Orphan<capnp::schema::Node::SourceInfo> newSourceInfo;
  Builder scopes;
  NullableValue<capnp::compiler::BrandedDecl> _decl1554;
  Array<capnp::compiler::BrandedDecl> result;
  String typeName;
  Vector<capnp::compiler::BrandScope_*> levels;
  Orphan<capnp::schema::Node> newStruct;
  Builder bindings;
  DuplicateOrdinalDetector dupDetector;
  Builder methodBuilder;
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  methods;
  Reader params;
  Builder s;
  Builder sourceInfo;
  Builder implicitsBuilder;
  Builder sourceInfoList;
  Builder list;
  Builder superclassesBuilder;
  Reader superclassesDecl;
  SegmentBuilder *pSVar75;
  undefined8 uVar76;
  SegmentBuilder *local_8c8;
  undefined1 uVar77;
  char cVar78;
  undefined1 uVar79;
  undefined6 in_stack_fffffffffffff742;
  uint uVar80;
  BrandScope *pBVar81;
  SegmentBuilder *in_stack_fffffffffffff768;
  SegmentBuilder *pSVar82;
  SegmentBuilder *pSStack_890;
  BrandScope *local_888;
  BrandScope *pBStack_880;
  undefined8 local_878;
  StructReader local_868;
  undefined8 local_838;
  _Base_ptr local_830;
  undefined1 local_828 [48];
  StructBuilder local_7f8;
  Vector<capnp::compiler::BrandScope_*> local_7c8;
  SegmentBuilder *local_7a0;
  SegmentBuilder *local_798;
  ulong local_790;
  ListBuilder local_788;
  undefined1 local_760 [8];
  BrandScope *local_758;
  StructBuilder local_750;
  uint local_728;
  ElementCount local_724;
  NodeTranslator *local_720;
  OrphanBuilder local_718;
  undefined1 local_6f8 [72];
  StructOrGroup aSStack_6b0 [5];
  Arena local_688;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
  local_668;
  MemberInfo **ppMStack_638;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_630;
  MemberInfo **ppMStack_628;
  ArrayDisposer *local_620;
  undefined1 local_618 [8];
  BrandedDecl BStack_610;
  int local_558;
  undefined8 local_550 [4];
  ElementSize local_52a;
  int local_528;
  undefined8 local_520 [4];
  bool local_500;
  undefined8 local_4d0 [5];
  undefined8 local_4a8 [5];
  anon_union_8_2_6a1c0e2c_for_MemberInfo_21 local_480;
  SegmentBuilder *local_478;
  SegmentBuilder *pSStack_470;
  undefined8 *local_468;
  String local_458;
  undefined1 local_438 [28];
  uint uStack_41c;
  StructDataBitCount local_418;
  StructPointerCount SStack_414;
  ElementSize EStack_412;
  undefined1 uStack_411;
  int iStack_410;
  undefined4 uStack_40c;
  ListReader local_408;
  OrphanBuilder local_3d8;
  ListReader local_3b8;
  undefined1 local_388 [8];
  SegmentBuilder *pSStack_380;
  ArrayDisposer *local_378;
  anon_union_48_1_a8c68091_for_NullableValue<capnp::compiler::LocatedInteger::Reader>_2 aStack_370;
  SegmentBuilder *local_338;
  undefined1 local_330 [8];
  long *local_328;
  StructBuilder local_320;
  BrandedDecl *local_2f8;
  Reader *local_2f0;
  ObjectHeader **local_2e8;
  MemberInfo ***local_2e0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
  *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  WirePointer **local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  size_t *local_2a8;
  _Base_ptr local_2a0;
  OrphanBuilder *local_298;
  _Rb_tree_node_base *local_290;
  undefined1 local_288 [8];
  _Rb_tree_node_base _Stack_280;
  size_t local_260;
  StructReader local_258;
  SegmentBuilder *local_228;
  SegmentBuilder *pSStack_220;
  BrandScope *local_218;
  SegmentBuilder *pSStack_210;
  StructDataBitCount local_208;
  StructPointerCount SStack_204;
  ElementSize EStack_202;
  undefined1 uStack_201;
  StructReader local_1f8;
  PointerBuilder local_1c8;
  StructReader local_1b0;
  StructBuilder local_180;
  StructBuilder local_158;
  ListReader local_130;
  ListBuilder local_100;
  ListBuilder local_d8;
  ListBuilder local_b0;
  ListBuilder local_88;
  ListReader local_60;
  
  *(undefined2 *)((long)builder._builder.data + 0xc) = 3;
  p_Var40 = (_Base_ptr)(builder._builder.pointers + 3);
  local_618 = (undefined1  [8])builder._builder.segment;
  BStack_610.body.tag = (uint)builder._builder.capTable;
  uVar67 = BStack_610.body.tag;
  BStack_610.body._4_4_ = builder._builder.capTable._4_4_;
  uVar34 = BStack_610.body._4_4_;
  BStack_610.body.field_1._0_8_ = p_Var40;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_618);
  uVar51 = builder._builder.segment._0_4_;
  iVar36 = builder._builder.segment._4_4_;
  local_618 = (undefined1  [8])builder._builder.segment;
  BStack_610.body.tag = uVar67;
  BStack_610.body._4_4_ = uVar34;
  BStack_610.body.field_1._0_8_ = (_Base_ptr)(builder._builder.pointers + 4);
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_618);
  if (decl._reader.pointerCount < 6) {
    decl._reader.nestingLimit = 0x7fffffff;
    decl._reader.capTable = (CapTableReader *)0x0;
    pWVar53 = (WirePointer *)0x0;
    decl._reader.segment = (SegmentReader *)0x0;
  }
  else {
    pWVar53 = decl._reader.pointers + 5;
  }
  BStack_610.body.tag = (uint)decl._reader.capTable;
  BStack_610.body._4_4_ = SUB84((ulong)decl._reader.capTable >> 0x20,0);
  BStack_610.body.field_1._0_4_ = SUB84(pWVar53,0);
  BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pWVar53 >> 0x20);
  local_618 = (undefined1  [8])decl._reader.segment;
  BStack_610.body.field_1._8_4_ = decl._reader.nestingLimit;
  capnp::_::PointerReader::getList
            (&local_60,(PointerReader *)local_618,INLINE_COMPOSITE,(word *)0x0);
  local_618 = (undefined1  [8])CONCAT44(iVar36,uVar51);
  BStack_610.body.tag = (uint)builder._builder.capTable;
  BStack_610.body._4_4_ = SUB84((ulong)builder._builder.capTable >> 0x20,0);
  local_830 = (_Base_ptr)local_618;
  BStack_610.body.field_1._0_8_ = (_Base_ptr)(builder._builder.pointers + 4);
  capnp::_::PointerBuilder::initStructList
            (&local_88,(PointerBuilder *)local_830,local_60.elementCount,(StructSize)0x10001);
  local_798 = (SegmentBuilder *)(ulong)local_60.elementCount;
  local_720 = this;
  if (local_798 != (SegmentBuilder *)0x0) {
    local_830 = local_830 + 4;
    pSVar56 = (SegmentBuilder *)0x0;
    do {
      capnp::_::ListReader::getStructElement(&local_868,&local_60,(ElementCount)pSVar56);
      aStack_370._8_4_ = 0;
      aStack_370._12_2_ = 0;
      aStack_370._14_2_ = 0;
      aStack_370._16_4_ = 0;
      aStack_370._20_2_ = 0;
      local_378 = (ArrayDisposer *)0x0;
      aStack_370._0_6_ = 0;
      aStack_370._6_2_ = 0;
      local_388 = (undefined1  [8])0x0;
      pSStack_380 = (SegmentBuilder *)0x0;
      aStack_370._22_1_ = 7;
      aStack_370._24_4_ = 0x7fffffff;
      implicitMethodParams.params.reader._44_4_ = aStack_370._28_4_;
      implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
      implicitMethodParams.params.reader._39_1_ = aStack_370._23_1_;
      implicitMethodParams.params.reader.structDataSize = 0;
      implicitMethodParams.params.reader.structPointerCount = 0;
      implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
      source._reader.capTable = local_868.capTable;
      source._reader.segment = local_868.segment;
      source._reader.data = local_868.data;
      source._reader.pointers = local_868.pointers;
      source._reader.dataSize = local_868.dataSize;
      source._reader.pointerCount = local_868.pointerCount;
      source._reader._38_2_ = local_868._38_2_;
      source._reader.nestingLimit = local_868.nestingLimit;
      source._reader._44_4_ = local_868._44_4_;
      auVar11 = ZEXT1640(ZEXT816(0));
      implicitMethodParams.scopeId = auVar11._0_8_;
      implicitMethodParams.params.reader.segment = (SegmentReader *)auVar11._8_8_;
      implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar11._16_8_;
      implicitMethodParams.params.reader.ptr = (byte *)auVar11._24_8_;
      implicitMethodParams.params.reader.elementCount = auVar11._32_4_;
      implicitMethodParams.params.reader.step = auVar11._36_4_;
      BrandScope::compileDeclExpression
                ((Maybe<capnp::compiler::BrandedDecl> *)local_6f8,(this->localBrand).ptr,source,
                 this->resolver,implicitMethodParams);
      local_618[0] = local_6f8[0];
      if (local_6f8[0] == true) {
        if (local_6f8._8_4_ == 2) {
          BStack_610.body.field_1._0_8_ = CONCAT44(local_6f8._20_4_,local_6f8._16_4_);
          BStack_610.body.field_1._8_4_ = local_6f8._24_4_;
          BStack_610.body.field_1._12_4_ = local_6f8._28_4_;
        }
        else if (local_6f8._8_4_ == 1) {
          BStack_610.body.field_1._32_4_ = local_6f8._48_4_;
          BStack_610.body.field_1._36_4_ = local_6f8._52_4_;
          BStack_610.body.field_1._16_4_ = local_6f8._32_4_;
          BStack_610.body.field_1._20_2_ = (undefined2)local_6f8._36_4_;
          BStack_610.body.field_1._22_2_ = SUB42(local_6f8._36_4_,2);
          BStack_610.body.field_1._24_4_ = local_6f8._40_4_;
          BStack_610.body.field_1._28_4_ = local_6f8._44_4_;
          BStack_610.body.field_1._0_8_ = CONCAT44(local_6f8._20_4_,local_6f8._16_4_);
          BStack_610.body.field_1._8_4_ = local_6f8._24_4_;
          BStack_610.body.field_1._12_4_ = local_6f8._28_4_;
          BStack_610.body.field_1.space[0x28] = local_6f8[0x38];
          if (local_6f8[0x38] == '\x01') {
            BStack_610.body.field_1._80_8_ = aSStack_6b0[3]._vptr_StructOrGroup;
            BStack_610.body.field_1._88_8_ = aSStack_6b0[4]._vptr_StructOrGroup;
            BStack_610.body.field_1._64_6_ = SUB86(aSStack_6b0[1]._vptr_StructOrGroup,0);
            BStack_610.body.field_1._70_2_ =
                 (undefined2)((ulong)aSStack_6b0[1]._vptr_StructOrGroup >> 0x30);
            BStack_610.body.field_1._72_8_ = aSStack_6b0[2]._vptr_StructOrGroup;
            BStack_610.body.field_1._48_8_ = local_6f8._64_8_;
            BStack_610.body.field_1._56_6_ = SUB86(aSStack_6b0[0]._vptr_StructOrGroup,0);
            BStack_610.body.field_1._62_2_ =
                 (undefined2)((ulong)aSStack_6b0[0]._vptr_StructOrGroup >> 0x30);
            local_6f8._56_8_ = local_6f8._56_8_ & 0xffffffffffffff00;
          }
        }
        local_830[1]._M_color = local_668._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_;
        *(undefined4 *)&local_830[1].field_0x4 =
             local_668._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_;
        *(undefined4 *)&local_830[1]._M_parent =
             local_668._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
        *(undefined4 *)((long)&local_830[1]._M_parent + 4) =
             local_668._M_impl.super__Rb_tree_header._M_header._M_left._4_4_;
        *(undefined4 *)&local_830->_M_left = local_668._M_impl._0_4_;
        *(undefined4 *)((long)&local_830->_M_left + 4) = local_668._M_impl._4_4_;
        *(_Rb_tree_color *)&local_830->_M_right =
             local_668._M_impl.super__Rb_tree_header._M_header._M_color;
        *(undefined4 *)((long)&local_830->_M_right + 4) =
             local_668._M_impl.super__Rb_tree_header._M_header._4_4_;
        local_830->_M_color = local_688.objectList._0_4_;
        *(undefined4 *)&local_830->field_0x4 = local_688.objectList._4_4_;
        *(undefined4 *)&local_830->_M_parent = local_688.currentChunk._0_4_;
        *(undefined4 *)((long)&local_830->_M_parent + 4) = local_688.currentChunk._4_4_;
        BStack_610.brand.ptr = (BrandScope *)local_688.chunkList;
        BStack_610.brand.disposer = (Disposer *)local_688.nextChunkSize;
        BStack_610.body.tag = local_6f8._8_4_;
        local_688.chunkList = (ChunkHeader *)0x0;
        if (local_6f8._8_4_ == 1) {
          local_6f8._8_4_ = 0;
        }
        if (local_6f8._8_4_ == 2) {
          local_6f8._8_4_ = 0;
        }
      }
      if (local_6f8[0] == true) {
        BrandedDecl::getKind(&BStack_610);
        if (local_6f8[0] == true) {
          if (local_6f8._2_2_ == 9) {
            capnp::_::ListBuilder::getStructElement
                      ((StructBuilder *)&local_1b0,&local_88,(ElementCount)pSVar56);
            local_388[0] = BStack_610.body.tag == 1;
            if (BStack_610.body.tag != 1) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                        ((Fault *)local_6f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                         ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                         (DebugExpression<bool> *)local_388);
              kj::_::Debug::Fault::fatal((Fault *)local_6f8);
            }
            local_438._0_8_ = (SegmentReader *)0x0;
            local_438._8_8_ = (SegmentReader *)0x0;
            local_438._16_8_ = (SegmentReader *)0x0;
            stack0xfffffffffffffbe0 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
            uVar77 = SUB81(BStack_610.brand.ptr,0);
            uVar79 = (undefined1)((ulong)BStack_610.brand.ptr >> 8);
            in_stack_fffffffffffff742 = (undefined6)((ulong)BStack_610.brand.ptr >> 0x10);
            pBVar81 = BStack_610.brand.ptr;
            do {
              if (((pBVar81->params).size_ != 0) ||
                 ((pBVar81->inherited == true && (pBVar81->leafParamCount != 0)))) {
                if (local_438._8_8_ == local_438._16_8_) {
                  sVar61 = (long)(local_438._16_8_ - local_438._0_8_) >> 2;
                  if (local_438._16_8_ == local_438._0_8_) {
                    sVar61 = 4;
                  }
                  kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                            ((Vector<capnp::compiler::BrandScope_*> *)local_438,sVar61);
                }
                *(Arena **)local_438._8_8_ = (Arena *)pBVar81;
                local_438._8_8_ = local_438._8_8_ + 8;
              }
              pBVar81 = (pBVar81->parent).ptr.ptr;
            } while (pBVar81 != (BrandScope *)0x0);
            if (local_438._8_8_ != local_438._0_8_) {
              local_3b8.segment = local_1b0.segment;
              local_3b8.capTable = local_1b0.capTable;
              local_3b8.ptr = (byte *)local_1b0.pointers;
              capnp::_::PointerBuilder::initStruct
                        ((StructBuilder *)local_388,(PointerBuilder *)&local_3b8,(StructSize)0x10000
                        );
              local_3b8.ptr = (byte *)CONCAT26(aStack_370._6_2_,aStack_370._0_6_);
              local_3b8.segment = (SegmentReader *)local_388;
              local_3b8.capTable = (CapTableReader *)pSStack_380;
              capnp::_::PointerBuilder::initStructList
                        ((ListBuilder *)local_6f8,(PointerBuilder *)&local_3b8,
                         (ElementCount)((ulong)(local_438._8_8_ - local_438._0_8_) >> 3),
                         (StructSize)0x10002);
              if (local_438._8_8_ - local_438._0_8_ != 0) {
                uVar58 = (long)(local_438._8_8_ - local_438._0_8_) >> 3;
                uVar69 = 0;
                local_7a0 = pSVar56;
                do {
                  capnp::_::ListBuilder::getStructElement
                            ((StructBuilder *)local_388,(ListBuilder *)local_6f8,
                             (ElementCount)uVar69);
                  uVar68 = uVar69 & 0xffffffff;
                  pBVar81 = (BrandScope *)((Arena **)local_438._0_8_)[uVar68];
                  local_378->_vptr_ArrayDisposer = (_func_int **)pBVar81->leafId;
                  local_790 = uVar69;
                  if (pBVar81->inherited == true) {
                    *(undefined2 *)&local_378[1]._vptr_ArrayDisposer = 1;
                  }
                  else {
                    sVar61 = (((BrandScope *)((Arena **)local_438._0_8_)[uVar68])->params).size_;
                    *(undefined2 *)&local_378[1]._vptr_ArrayDisposer = 0;
                    _Stack_280._M_parent = (_Base_ptr)CONCAT26(aStack_370._6_2_,aStack_370._0_6_);
                    local_288 = local_388;
                    _Stack_280._0_8_ = pSStack_380;
                    capnp::_::PointerBuilder::initStructList
                              ((ListBuilder *)&local_3b8,(PointerBuilder *)local_288,
                               (ElementCount)sVar61,(StructSize)0x10001);
                    uVar69 = (ulong)local_3b8.elementCount;
                    pSVar56 = local_7a0;
                    this = local_720;
                    if (uVar69 != 0) {
                      lVar45 = 0;
                      uVar71 = 0;
                      do {
                        pBVar7 = (((BrandScope *)((Arena **)local_438._0_8_)[uVar68])->params).ptr;
                        pEVar59 = *(ErrorReporter **)
                                   (CONCAT62(in_stack_fffffffffffff742,CONCAT11(uVar79,uVar77)) +
                                   0x10);
                        capnp::_::ListBuilder::getStructElement
                                  ((StructBuilder *)local_288,(ListBuilder *)&local_3b8,
                                   (ElementCount)uVar71);
                        *(undefined2 *)
                         &((WireValue<uint32_t> *)&(_Stack_280._M_parent)->_M_color)->value = 1;
                        local_258.segment = (SegmentReader *)local_288;
                        local_258.capTable = (CapTableReader *)_Stack_280._0_8_;
                        local_258.data = _Stack_280._M_left;
                        capnp::_::PointerBuilder::initStruct
                                  ((StructBuilder *)&local_408,(PointerBuilder *)&local_258,
                                   (StructSize)0x10003);
                        target._builder.pointerCount = local_408.structPointerCount;
                        target._builder._38_1_ = local_408.elementSize;
                        target._builder._39_1_ = local_408._39_1_;
                        target._builder.dataSize = local_408.structDataSize;
                        target._builder.segment._4_4_ = local_408.segment._4_4_;
                        target._builder.segment._0_4_ = (uint)local_408.segment;
                        target._builder.capTable._4_4_ = local_408.capTable._4_4_;
                        target._builder.capTable._0_4_ = (uint)local_408.capTable;
                        target._builder.data._4_4_ = local_408.ptr._4_4_;
                        target._builder.data._0_4_ = (uint)local_408.ptr;
                        target._builder.pointers._4_4_ = local_408.step;
                        target._builder.pointers._0_4_ = local_408.elementCount;
                        BrandedDecl::compileAsType
                                  ((BrandedDecl *)((long)&(pBVar7->body).tag + lVar45),pEVar59,
                                   target);
                        uVar71 = uVar71 + 1;
                        lVar45 = lVar45 + 0xa8;
                        pSVar56 = local_7a0;
                        this = local_720;
                      } while (uVar69 != uVar71);
                    }
                  }
                  uVar69 = local_790 + 1;
                } while (uVar69 != uVar58);
              }
            }
            uVar23 = local_438._16_8_;
            uVar76 = local_438._8_8_;
            uVar66 = local_438._0_8_;
            if ((SegmentReader *)local_438._0_8_ != (SegmentReader *)0x0) {
              local_438._0_8_ = (SegmentReader *)0x0;
              local_438._8_8_ = (SegmentReader *)0x0;
              local_438._16_8_ = (SegmentReader *)0x0;
              in_R8 = (SegmentBuilder *)((long)(uVar23 - uVar66) >> 3);
              (**stack0xfffffffffffffbe0->_vptr_ArrayDisposer)
                        (stack0xfffffffffffffbe0,uVar66,8,(long)(uVar76 - uVar66) >> 3);
            }
            *(undefined8 *)local_1b0.data = BStack_610.body.field_1._0_8_;
          }
          else {
            pEVar59 = this->errorReporter;
            BrandedDecl::toString((String *)local_388,&BStack_610);
            kj::str<char_const(&)[2],kj::String,char_const(&)[23]>
                      ((String *)local_6f8,(kj *)0x2223ec,(char (*) [2])local_388,
                       (String *)"\' is not an interface.",(char (*) [23])in_R8);
            in_R8 = (SegmentBuilder *)
                    (CONCAT44(local_6f8._12_4_,local_6f8._8_4_) +
                    (ulong)(CONCAT44(local_6f8._12_4_,local_6f8._8_4_) == 0));
            uVar58 = 0;
            uVar69 = 0;
            if (0x3f < BStack_610.source._reader.dataSize) {
              uVar69 = (ulong)*(uint *)(CONCAT44(BStack_610.source._reader.data._4_4_,
                                                 (int)BStack_610.source._reader.data) + 4);
            }
            if (0x9f < BStack_610.source._reader.dataSize) {
              uVar58 = (ulong)*(uint *)(CONCAT44(BStack_610.source._reader.data._4_4_,
                                                 (int)BStack_610.source._reader.data) + 0x10);
            }
            (**pEVar59->_vptr_ErrorReporter)(pEVar59,uVar69,uVar58);
            lVar45 = CONCAT44(local_6f8._4_4_,
                              CONCAT22(local_6f8._2_2_,CONCAT11(local_6f8[1],local_6f8[0])));
            if (lVar45 != 0) {
              in_R8 = (SegmentBuilder *)CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
              local_6f8[0] = false;
              local_6f8[1] = 0;
              local_6f8._2_2_ = 0;
              local_6f8._4_4_ = 0;
              local_6f8._8_4_ = 0;
              local_6f8._12_4_ = 0;
              (*(code *)**(undefined8 **)CONCAT44(local_6f8._20_4_,local_6f8._16_4_))
                        ((undefined8 *)CONCAT44(local_6f8._20_4_,local_6f8._16_4_),lVar45,1);
            }
            pSVar64 = pSStack_380;
            auVar62 = local_388;
            if (local_388 != (undefined1  [8])0x0) {
              local_388 = (undefined1  [8])0x0;
              pSStack_380 = (SegmentBuilder *)0x0;
              (**local_378->_vptr_ArrayDisposer)(local_378,auVar62,1);
              in_R8 = pSVar64;
            }
          }
        }
        else {
          pEVar59 = this->errorReporter;
          BrandedDecl::toString((String *)local_388,&BStack_610);
          kj::str<char_const(&)[2],kj::String,char_const(&)[79]>
                    ((String *)local_6f8,(kj *)0x2223ec,(char (*) [2])local_388,
                     (String *)
                     "\' is an unbound generic parameter. Currently we don\'t support extending these."
                     ,(char (*) [79])in_R8);
          in_R8 = (SegmentBuilder *)
                  (CONCAT44(local_6f8._12_4_,local_6f8._8_4_) +
                  (ulong)(CONCAT44(local_6f8._12_4_,local_6f8._8_4_) == 0));
          uVar58 = 0;
          uVar69 = 0;
          if (0x3f < BStack_610.source._reader.dataSize) {
            uVar69 = (ulong)*(uint *)(CONCAT44(BStack_610.source._reader.data._4_4_,
                                               (int)BStack_610.source._reader.data) + 4);
          }
          if (0x9f < BStack_610.source._reader.dataSize) {
            uVar58 = (ulong)*(uint *)(CONCAT44(BStack_610.source._reader.data._4_4_,
                                               (int)BStack_610.source._reader.data) + 0x10);
          }
          (**pEVar59->_vptr_ErrorReporter)(pEVar59,uVar69,uVar58);
          lVar45 = CONCAT44(local_6f8._4_4_,
                            CONCAT22(local_6f8._2_2_,CONCAT11(local_6f8[1],local_6f8[0])));
          if (lVar45 != 0) {
            in_R8 = (SegmentBuilder *)CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
            local_6f8[0] = false;
            local_6f8[1] = 0;
            local_6f8._2_2_ = 0;
            local_6f8._4_4_ = 0;
            local_6f8._8_4_ = 0;
            local_6f8._12_4_ = 0;
            (*(code *)**(undefined8 **)CONCAT44(local_6f8._20_4_,local_6f8._16_4_))
                      ((undefined8 *)CONCAT44(local_6f8._20_4_,local_6f8._16_4_),lVar45,1,in_R8,
                       in_R8,0);
          }
          pSVar64 = pSStack_380;
          auVar62 = local_388;
          if (local_388 != (undefined1  [8])0x0) {
            local_388 = (undefined1  [8])0x0;
            pSStack_380 = (SegmentBuilder *)0x0;
            (**local_378->_vptr_ArrayDisposer)(local_378,auVar62,1);
            in_R8 = pSVar64;
          }
        }
      }
      pBVar81 = BStack_610.brand.ptr;
      if (local_618[0] == _S_black) {
        if (BStack_610.brand.ptr != (BrandScope *)0x0) {
          BStack_610.brand.ptr = (BrandScope *)0x0;
          (**(BStack_610.brand.disposer)->_vptr_Disposer)
                    (BStack_610.brand.disposer,
                     (pBVar81->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                     (long)&(pBVar81->super_Refcounted).super_Disposer._vptr_Disposer);
        }
        if (BStack_610.body.tag == 1) {
          BStack_610.body.tag = 0;
        }
        if (BStack_610.body.tag == 2) {
          BStack_610.body.tag = 0;
        }
      }
      pSVar56 = (SegmentBuilder *)((long)&(pSVar56->super_SegmentReader).arena + 1);
    } while (pSVar56 != local_798);
  }
  LVar15 = members.reader.elementCount;
  _Stack_280._M_left = &_Stack_280;
  _Stack_280._0_8_ = _Stack_280._0_8_ & 0xffffffff00000000;
  uVar67 = 0;
  _Stack_280._M_parent = (_Base_ptr)0x0;
  local_260 = 0;
  _Stack_280._M_right = _Stack_280._M_left;
  if (members.reader.elementCount != 0) {
    EVar72 = 0;
    do {
      capnp::_::ListReader::getStructElement((StructReader *)local_388,&members.reader,EVar72);
      if ((0x1f < (uint)aStack_370._8_4_) &&
         (*(short *)((long)&local_378->_vptr_ArrayDisposer + 2) == 10)) {
        if ((ushort)aStack_370._12_2_ < 2) {
          local_6f8._24_4_ = 0x7fffffff;
          pSVar56 = (SegmentBuilder *)0x0;
          lVar45 = 0;
          auVar62 = (undefined1  [8])0x0;
        }
        else {
          lVar45 = CONCAT26(aStack_370._6_2_,aStack_370._0_6_) + 8;
          pSVar56 = pSStack_380;
          auVar62 = local_388;
          local_6f8._24_4_ = aStack_370._16_4_;
        }
        local_6f8[0] = SUB81(auVar62,0);
        local_6f8[1] = (undefined1)((ulong)auVar62 >> 8);
        local_6f8._2_2_ = (undefined2)((ulong)auVar62 >> 0x10);
        local_6f8._4_4_ = (undefined4)((ulong)auVar62 >> 0x20);
        local_6f8._8_4_ = SUB84(pSVar56,0);
        local_6f8._12_4_ = (undefined4)((ulong)pSVar56 >> 0x20);
        local_6f8._16_4_ = (undefined4)lVar45;
        local_6f8._20_4_ = (undefined4)((ulong)lVar45 >> 0x20);
        capnp::_::PointerReader::getStruct(&local_868,(PointerReader *)local_6f8,(word *)0x0);
        if (local_868.dataSize < 0x40) {
          local_618 = (undefined1  [8])0x0;
        }
        else {
          local_618 = (undefined1  [8])
                      (((Refcounted *)local_868.data)->super_Disposer)._vptr_Disposer;
        }
        local_6f8._36_4_ = aStack_370._8_4_;
        local_6f8._40_4_ =
             (undefined4)
             (CONCAT26(aStack_370._14_2_,CONCAT24(aStack_370._12_2_,aStack_370._8_4_)) >> 0x20);
        local_6f8._44_4_ = aStack_370._16_4_;
        local_6f8._48_4_ =
             (undefined4)
             (CONCAT17(aStack_370._23_1_,
                       CONCAT16(aStack_370._22_1_,CONCAT24(aStack_370._20_2_,aStack_370._16_4_))) >>
             0x20);
        local_6f8._20_4_ = SUB84(local_378,0);
        local_6f8._24_4_ = (undefined4)((ulong)local_378 >> 0x20);
        local_6f8._28_4_ = (undefined4)aStack_370._0_6_;
        local_6f8._32_4_ = (undefined4)(CONCAT26(aStack_370._6_2_,aStack_370._0_6_) >> 0x20);
        local_6f8._4_4_ = local_388._0_4_;
        local_6f8._8_4_ = local_388._4_4_;
        local_6f8._12_4_ = SUB84(pSStack_380,0);
        local_6f8._16_4_ = (undefined4)((ulong)pSStack_380 >> 0x20);
        BStack_610.body.field_1._44_4_ = local_6f8._48_4_;
        BStack_610.body._4_4_ = CONCAT22(local_6f8._2_2_,CONCAT11(local_6f8[1],local_6f8[0]));
        BStack_610.body.field_1._28_4_ = local_6f8._32_4_;
        BStack_610.body.field_1._32_4_ = aStack_370._8_4_;
        BStack_610.body.field_1._36_4_ = local_6f8._40_4_;
        BStack_610.body.field_1._40_4_ = aStack_370._16_4_;
        BStack_610.body.field_1._12_4_ = local_6f8._16_4_;
        BStack_610.body.field_1._16_4_ = local_6f8._20_4_;
        BStack_610.body.field_1._20_2_ = (undefined2)((ulong)local_378 >> 0x20);
        BStack_610.body.field_1._22_2_ = (undefined2)((ulong)local_378 >> 0x30);
        BStack_610.body.field_1._24_4_ = local_6f8._28_4_;
        BStack_610.body.field_1._0_4_ = local_6f8._4_4_;
        BStack_610.body.field_1._4_4_ = local_6f8._8_4_;
        BStack_610.body.field_1._8_4_ = local_6f8._12_4_;
        BStack_610.body.tag = uVar67;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
        ::
        _M_emplace_equal<std::pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
                    *)local_288,
                   (pair<unsigned_long,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>
                    *)local_618);
        uVar67 = uVar67 + 1;
      }
      EVar72 = EVar72 + 1;
    } while (LVar15 != EVar72);
  }
  local_618 = (undefined1  [8])CONCAT44(iVar36,uVar51);
  BStack_610.body.tag = (uint)builder._builder.capTable;
  BStack_610.body._4_4_ = SUB84((ulong)builder._builder.capTable >> 0x20,0);
  BStack_610.body.field_1._0_8_ = p_Var40;
  capnp::_::PointerBuilder::initStructList
            (&local_b0,(PointerBuilder *)local_618,(ElementCount)local_260,(StructSize)0x50003);
  this_00 = local_720;
  capnp::_::OrphanBuilder::asStruct
            ((StructBuilder *)local_618,&(local_720->sourceInfo).builder,(StructSize)0x20002);
  local_6f8._16_8_ = CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_) + 8;
  local_6f8[0] = local_618[0];
  local_6f8[1] = local_618[1];
  local_6f8._2_2_ = local_618._2_2_;
  local_6f8._4_4_ = local_618._4_4_;
  local_6f8._8_4_ = BStack_610.body.tag;
  local_6f8._12_4_ = BStack_610.body._4_4_;
  capnp::_::PointerBuilder::initStructList
            (&local_d8,(PointerBuilder *)local_6f8,(ElementCount)local_260,(StructSize)0x10001);
  local_388 = (undefined1  [8])this_00->errorReporter;
  pSStack_380 = (SegmentBuilder *)((ulong)pSStack_380 & 0xffffffff00000000);
  local_378 = (ArrayDisposer *)((ulong)local_378 & 0xffffffffffffff00);
  if (_Stack_280._M_left != &_Stack_280) {
    local_2f0 = &BStack_610.source;
    local_2e8 = &local_688.objectList;
    local_298 = &(this_00->wipNode).builder;
    local_2a0 = &local_668._M_impl.super__Rb_tree_header._M_header;
    local_2a8 = &local_668._M_impl.super__Rb_tree_header._M_node_count;
    local_2b0 = local_4a8;
    local_2b8 = local_4d0;
    local_2c0 = &BStack_610.source._reader.pointers;
    local_2f8 = (BrandedDecl *)&this_00->paramStructs;
    local_2c8 = local_550;
    local_2d0 = local_520;
    local_2e0 = &ppMStack_638;
    local_2d8 = &local_668;
    local_724 = 0;
    p_Var41 = _Stack_280._M_left;
    do {
      EVar72 = local_724;
      pSVar56 = pSStack_890;
      local_798 = (SegmentBuilder *)p_Var41[1]._M_left;
      p_Var50 = p_Var41[1]._M_right;
      local_830 = p_Var41[2]._M_parent;
      uVar3 = *(ushort *)((long)&p_Var41[2]._M_left + 4);
      BStack_610.body.field_1._8_4_ = *(undefined4 *)&p_Var41[2]._M_right;
      local_790 = CONCAT62(local_790._2_6_,uVar3);
      local_7a0 = (SegmentBuilder *)CONCAT44(local_7a0._4_4_,BStack_610.body.field_1._8_4_);
      if (uVar3 < 2) {
        p_Var38 = (_Base_ptr)0x0;
        pp_Var37 = (_Base_ptr *)0x0;
        local_618 = (undefined1  [8])0x0;
        BStack_610.body.field_1._8_4_ = 0x7fffffff;
      }
      else {
        pp_Var37 = &local_830->_M_parent;
        p_Var38 = p_Var50;
        local_618 = (undefined1  [8])local_798;
      }
      uVar34 = *(undefined4 *)&p_Var41[1]._M_parent;
      pSVar64 = *(SegmentBuilder **)(p_Var41 + 2);
      uVar80 = *(uint *)&p_Var41[2]._M_left;
      BStack_610.body.tag = (uint)p_Var38;
      BStack_610.body._4_4_ = SUB84((ulong)p_Var38 >> 0x20,0);
      BStack_610.body.field_1._0_4_ = SUB84(pp_Var37,0);
      BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pp_Var37 >> 0x20);
      pSVar49 = pSVar64;
      local_290 = p_Var41;
      capnp::_::PointerReader::getStruct(&local_1b0,(PointerReader *)local_618,(word *)0x0);
      ordinal._reader.pointerCount = local_1b0.pointerCount;
      ordinal._reader._38_2_ = local_1b0._38_2_;
      ordinal._reader.dataSize = local_1b0.dataSize;
      ordinal._reader.capTable = local_1b0.capTable;
      ordinal._reader.segment = local_1b0.segment;
      ordinal._reader.data = local_1b0.data;
      ordinal._reader.pointers = local_1b0.pointers;
      ordinal._reader.nestingLimit = local_1b0.nestingLimit;
      ordinal._reader._44_4_ = local_1b0._44_4_;
      DuplicateOrdinalDetector::check((DuplicateOrdinalDetector *)local_388,ordinal);
      if (local_1b0.dataSize < 0x40) {
        local_728 = 0;
      }
      else {
        local_728 = (uint)*local_1b0.data;
      }
      capnp::_::ListBuilder::getStructElement(&local_158,&local_d8,EVar72);
      if ((ushort)local_790 < 5) {
        local_618 = (undefined1  [8])0x0;
        BStack_610.body.tag = 0;
        BStack_610.body._4_4_ = 0;
        BStack_610.body.field_1._0_8_ = (_Base_ptr)0x0;
        BStack_610.body.field_1._8_4_ = 0x7fffffff;
      }
      else {
        BStack_610.body.field_1._0_8_ = local_830 + 1;
        local_618 = (undefined1  [8])local_798;
        BStack_610.body.tag = (uint)p_Var50;
        BStack_610.body._4_4_ = SUB84((ulong)p_Var50 >> 0x20,0);
        BStack_610.body.field_1._8_4_ = (ListElementCount)local_7a0;
      }
      PVar32 = capnp::_::PointerReader::getPointerType((PointerReader *)local_618);
      if (PVar32 != NULL_) {
        if ((ushort)local_790 < 5) {
          BStack_610.body.field_1._8_4_ = 0x7fffffff;
          p_Var41 = (_Base_ptr)0x0;
          p_Var38 = (_Base_ptr)0x0;
          local_618 = (undefined1  [8])0x0;
        }
        else {
          p_Var38 = local_830 + 1;
          p_Var41 = p_Var50;
          local_618 = (undefined1  [8])local_798;
          BStack_610.body.field_1._8_4_ = (ListElementCount)local_7a0;
        }
        BStack_610.body.tag = (uint)p_Var41;
        BStack_610.body._4_4_ = SUB84((ulong)p_Var41 >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(p_Var38,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)p_Var38 >> 0x20);
        RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_618,(void *)0x0,0);
        local_618 = (undefined1  [8])local_158.segment;
        BStack_610.body.tag = (uint)local_158.capTable;
        BStack_610.body._4_4_ = SUB84((ulong)local_158.capTable >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(local_158.pointers,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)local_158.pointers >> 0x20);
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_618,RVar74);
      }
      uVar33 = 0;
      uVar51 = 0;
      if (0x3f < uVar80) {
        uVar51 = *(undefined4 *)((long)&(pSVar49->super_SegmentReader).arena + 4);
      }
      *(undefined4 *)local_158.data = uVar51;
      if (0x5f < uVar80) {
        uVar33 = (undefined4)*(size_t *)&(pSVar49->super_SegmentReader).id.value;
      }
      *(undefined4 *)((long)local_158.data + 4) = uVar33;
      capnp::_::ListBuilder::getStructElement(&local_320,&local_b0,EVar72);
      if ((ushort)local_790 == 0) {
        local_6f8._24_4_ = 0x7fffffff;
        p_Var41 = (_Base_ptr)0x0;
        p_Var38 = (_Base_ptr)0x0;
        pSVar47 = (SegmentBuilder *)0x0;
      }
      else {
        p_Var41 = p_Var50;
        p_Var38 = local_830;
        pSVar47 = local_798;
        local_6f8._24_4_ = (ListElementCount)local_7a0;
      }
      local_6f8[0] = SUB81(pSVar47,0);
      local_6f8[1] = (undefined1)((ulong)pSVar47 >> 8);
      local_6f8._2_2_ = (undefined2)((ulong)pSVar47 >> 0x10);
      local_6f8._4_4_ = (undefined4)((ulong)pSVar47 >> 0x20);
      local_6f8._8_4_ = SUB84(p_Var41,0);
      local_6f8._12_4_ = (undefined4)((ulong)p_Var41 >> 0x20);
      local_6f8._16_4_ = SUB84(p_Var38,0);
      local_6f8._20_4_ = (undefined4)((ulong)p_Var38 >> 0x20);
      capnp::_::PointerReader::getStruct
                ((StructReader *)local_618,(PointerReader *)local_6f8,(word *)0x0);
      auVar62 = local_618;
      local_6f8._24_4_ = BStack_610.body.field_1._24_4_;
      local_6f8._8_4_ = BStack_610.body.tag;
      local_6f8._12_4_ = BStack_610.body._4_4_;
      local_6f8._16_4_ = BStack_610.body.field_1._8_4_;
      local_6f8._20_4_ = BStack_610.body.field_1._12_4_;
      if (BStack_610.body.field_1._20_2_ == 0) {
        local_6f8._8_4_ = 0;
        local_6f8._12_4_ = 0;
        local_6f8._16_4_ = 0;
        local_6f8._20_4_ = 0;
        auVar62 = (undefined1  [8])(SegmentBuilder *)0x0;
        local_6f8._24_4_ = 0x7fffffff;
      }
      local_6f8[0] = SUB81(auVar62,0);
      local_6f8[1] = (undefined1)((ulong)auVar62 >> 8);
      local_6f8._2_2_ = (undefined2)((ulong)auVar62 >> 0x10);
      local_6f8._4_4_ = (undefined4)((ulong)auVar62 >> 0x20);
      RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_6f8,(void *)0x0,0);
      local_6f8[0] = SUB81(local_320.segment,0);
      local_6f8[1] = (undefined1)((ulong)local_320.segment >> 8);
      local_6f8._2_2_ = (undefined2)((ulong)local_320.segment >> 0x10);
      local_6f8._4_4_ = (undefined4)((ulong)local_320.segment >> 0x20);
      local_6f8._8_4_ = SUB84(local_320.capTable,0);
      local_6f8._12_4_ = (undefined4)((ulong)local_320.capTable >> 0x20);
      local_6f8._16_4_ = SUB84(local_320.pointers,0);
      local_6f8._20_4_ = (undefined4)((ulong)local_320.pointers >> 0x20);
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_6f8,RVar74);
      *(short *)&(((Refcounted *)local_320.data)->super_Disposer)._vptr_Disposer = (short)uVar34;
      if ((ushort)local_790 < 8) {
        BStack_610.body.field_1._8_4_ = 0x7fffffff;
        p_Var41 = (_Base_ptr)0x0;
        pp_Var37 = (_Base_ptr *)0x0;
        local_618 = (undefined1  [8])0x0;
      }
      else {
        pp_Var37 = &local_830[1]._M_right;
        p_Var41 = p_Var50;
        local_618 = (undefined1  [8])local_798;
        BStack_610.body.field_1._8_4_ = (ListElementCount)local_7a0;
      }
      BStack_610.body.tag = (uint)p_Var41;
      BStack_610.body._4_4_ = SUB84((ulong)p_Var41 >> 0x20,0);
      BStack_610.body.field_1._0_4_ = SUB84(pp_Var37,0);
      BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pp_Var37 >> 0x20);
      capnp::_::PointerReader::getList
                ((ListReader *)local_438,(PointerReader *)local_618,INLINE_COMPOSITE,(word *)0x0);
      BStack_610.body.field_1._0_8_ = local_320.pointers + 4;
      local_618 = (undefined1  [8])local_320.segment;
      BStack_610.body.tag = (uint)local_320.capTable;
      BStack_610.body._4_4_ = SUB84((ulong)local_320.capTable >> 0x20,0);
      capnp::_::PointerBuilder::initStructList
                (&local_100,(PointerBuilder *)local_618,local_438._24_4_,(StructSize)0x10000);
      uVar58 = (ulong)stack0xfffffffffffffbe0 & 0xffffffff;
      if (uVar58 != 0) {
        uVar69 = 0;
        do {
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)local_6f8,&local_100,(ElementCount)uVar69);
          capnp::_::ListReader::getStructElement
                    ((StructReader *)local_618,(ListReader *)local_438,(ElementCount)uVar69);
          if (BStack_610.body.field_1._20_2_ == 0) {
            uVar34 = 0x7fffffff;
            local_868.capTable = (CapTableReader *)0x0;
            local_868.data = (void *)0x0;
            local_868.segment = (SegmentReader *)0x0;
          }
          else {
            local_868.capTable =
                 (CapTableReader *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
            local_868.data =
                 (void *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
            local_868.segment = (SegmentReader *)local_618;
            uVar34 = BStack_610.body.field_1._24_4_;
          }
          local_868.pointers = (WirePointer *)CONCAT44(local_868.pointers._4_4_,uVar34);
          RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&local_868,(void *)0x0,0);
          local_868.segment =
               (SegmentReader *)
               CONCAT44(local_6f8._4_4_,
                        CONCAT22(local_6f8._2_2_,CONCAT11(local_6f8[1],local_6f8[0])));
          local_868.capTable = (CapTableReader *)CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
          local_868.data = (void *)CONCAT44(local_6f8._28_4_,local_6f8._24_4_);
          capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_868,RVar74);
          uVar69 = uVar69 + 1;
        } while (uVar58 != uVar69);
      }
      if ((ushort)local_790 < 6) {
        BStack_610.body.field_1._8_4_ = 0x7fffffff;
        p_Var41 = (_Base_ptr)0x0;
        pp_Var37 = (_Base_ptr *)0x0;
        local_618 = (undefined1  [8])0x0;
      }
      else {
        pp_Var37 = &local_830[1]._M_parent;
        p_Var41 = p_Var50;
        local_618 = (undefined1  [8])local_798;
        BStack_610.body.field_1._8_4_ = (ListElementCount)local_7a0;
      }
      BStack_610.body.tag = (uint)p_Var41;
      BStack_610.body._4_4_ = SUB84((ulong)p_Var41 >> 0x20,0);
      BStack_610.body.field_1._0_4_ = SUB84(pp_Var37,0);
      BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pp_Var37 >> 0x20);
      capnp::_::PointerReader::getStruct(&local_258,(PointerReader *)local_618,(word *)0x0);
      if ((0xf < local_258.dataSize) && ((short)((WireValue<uint32_t> *)local_258.data)->value == 2)
         ) {
        uVar58 = 0;
        uVar69 = 0;
        if (0x3f < local_258.dataSize) {
          uVar69 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_258.data + 4))
                          ->upper32Bits;
        }
        if (0x5f < local_258.dataSize) {
          uVar58 = (ulong)*(uint *)((long)local_258.data + 8);
        }
        pSVar64 = (SegmentBuilder *)0x31;
        (**this_00->errorReporter->_vptr_ErrorReporter)(this_00->errorReporter,uVar69,uVar58);
      }
      if ((ushort)local_790 == 0) {
        BStack_610.body.field_1._8_4_ = 0x7fffffff;
        p_Var41 = (_Base_ptr)0x0;
        p_Var38 = (_Base_ptr)0x0;
        local_618 = (undefined1  [8])0x0;
      }
      else {
        p_Var41 = p_Var50;
        p_Var38 = local_830;
        local_618 = (undefined1  [8])local_798;
        BStack_610.body.field_1._8_4_ = (ListElementCount)local_7a0;
      }
      BStack_610.body.tag = (uint)p_Var41;
      BStack_610.body._4_4_ = SUB84((ulong)p_Var41 >> 0x20,0);
      BStack_610.body.field_1._0_4_ = SUB84(p_Var38,0);
      BStack_610.body.field_1._4_4_ = (undefined4)((ulong)p_Var38 >> 0x20);
      capnp::_::PointerReader::getStruct(&local_1f8,(PointerReader *)local_618,(word *)0x0);
      pCVar48 = local_1f8.capTable;
      pWVar53 = local_1f8.pointers;
      local_618 = (undefined1  [8])local_1f8.segment;
      BStack_610.body.field_1._8_4_ = local_1f8.nestingLimit;
      if (local_1f8.pointerCount == 0) {
        pCVar48 = (CapTableReader *)0x0;
        pWVar53 = (WirePointer *)0x0;
        local_618 = (undefined1  [8])(SegmentBuilder *)0x0;
        BStack_610.body.field_1._8_4_ = 0x7fffffff;
      }
      BStack_610.body.tag = (uint)pCVar48;
      BStack_610.body._4_4_ = SUB84((ulong)pCVar48 >> 0x20,0);
      BStack_610.body.field_1._0_4_ = SUB84(pWVar53,0);
      BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pWVar53 >> 0x20);
      RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_618,(void *)0x0,0);
      iVar60 = local_258.nestingLimit;
      SVar30 = local_258.dataSize;
      pBVar81 = (BrandScope *)local_258.pointers;
      pvVar10 = local_258.data;
      pSVar57 = (SegmentBuilder *)local_258.capTable;
      pSVar47 = (SegmentBuilder *)local_258.segment;
      uVar55 = (uint)((ulong)p_Var40 >> 0x20);
      uVar77 = (undefined1)local_258.pointerCount;
      uVar79 = (undefined1)(local_258.pointerCount >> 8);
      local_408.structDataSize = local_418;
      local_408.structPointerCount = SStack_414;
      local_408.elementSize = EStack_412;
      local_408._39_1_ = uStack_411;
      local_408.nestingLimit = iStack_410;
      local_408._44_4_ = uStack_40c;
      local_408.ptr._0_4_ = local_438._16_4_;
      local_408.ptr._4_4_ = local_438._20_4_;
      local_408.elementCount = local_438._24_4_;
      local_408.step = uStack_41c;
      local_408.segment._0_4_ = local_438._0_4_;
      local_408.segment._4_4_ = local_438._4_4_;
      local_408.capTable._0_4_ = local_438._8_4_;
      local_408.capTable._4_4_ = local_438._12_4_;
      if (local_258.dataSize < 0x10) {
        sVar31 = 0;
      }
      else {
        sVar31 = (short)((WireValue<uint32_t> *)local_258.data)->value;
      }
      if (sVar31 == 2) {
        (*this_00->resolver->_vptr_Resolver[8])
                  (local_618,this_00->resolver,"/capnp/stream.capnp",0x14);
        if (local_618[0] == _S_black) {
          if (BStack_610.body.field_1.space[0x20] == '\x01') {
            BStack_610.body.field_1._32_4_ = BStack_610.body.field_1._32_4_ & 0xffffff00;
          }
          (**(code **)(*(long *)CONCAT44(BStack_610.body.field_1._28_4_,
                                         BStack_610.body.field_1._24_4_) + 8))
                    (local_618,
                     (long *)CONCAT44(BStack_610.body.field_1._28_4_,BStack_610.body.field_1._24_4_)
                     ,"StreamResult",0xd);
          if (local_618[0] == _S_black) {
            if (BStack_610.body.tag == 1) {
              BStack_610.body.tag = 0;
            }
            if (BStack_610.body.tag == 2) {
              BStack_610.body.tag = 0;
            }
            pSVar56 = (SegmentBuilder *)0x995f9a3377c0b16e;
            goto LAB_001678d5;
          }
          uVar58 = 0;
          if (0x3f < SVar30) {
            uVar58 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pvVar10 + 4))->
                            upper32Bits;
          }
          pEVar59 = this_00->errorReporter;
          pSVar64 = (SegmentBuilder *)0x96;
          pcVar63 = 
          "The version of \'/capnp/stream.capnp\' found in your import path does not appear to be the official one; it is missing the declaration of StreamResult."
          ;
        }
        else {
          uVar58 = 0;
          if (0x3f < SVar30) {
            uVar58 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pvVar10 + 4))->
                            upper32Bits;
          }
          pEVar59 = this_00->errorReporter;
          pSVar64 = (SegmentBuilder *)0xb7;
          pcVar63 = 
          "A method declaration uses streaming, but \'/capnp/stream.capnp\' is not found in the import path. This is a standard file that should always be installed with the Cap\'n Proto compiler."
          ;
        }
        uVar69 = 0;
        if (0x5f < SVar30) {
          uVar69 = (ulong)*(uint *)((long)pvVar10 + 8);
        }
        (**pEVar59->_vptr_ErrorReporter)(pEVar59,uVar58,uVar69,pcVar63);
        pSVar56 = (SegmentBuilder *)0x995f9a3377c0b16e;
      }
      else if (sVar31 == 1) {
        local_868.capTable = local_258.capTable;
        local_868.data = local_258.pointers;
        local_868.segment = local_258.segment;
        iVar35 = local_258.nestingLimit;
        if (local_258.pointerCount == 0) {
          local_868.capTable = (CapTableReader *)(SegmentBuilder *)0x0;
          local_868.data = (BrandScope *)0x0;
          local_868.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
          iVar35 = 0x7fffffff;
        }
        local_868.pointers = (WirePointer *)CONCAT44(local_868.pointers._4_4_,iVar35);
        capnp::_::PointerReader::getStruct
                  ((StructReader *)&local_3b8,(PointerReader *)&local_868,(word *)0x0);
        local_868.capTable =
             (CapTableReader *)CONCAT44(local_408.segment._4_4_,(uint)local_408.segment);
        local_868.data = (void *)CONCAT44(local_408.capTable._4_4_,(uint)local_408.capTable);
        local_868.pointers = (WirePointer *)CONCAT44(local_408.ptr._4_4_,(uint)local_408.ptr);
        local_868._36_4_ = local_408.step;
        local_868.dataSize = local_408.elementCount;
        local_868._44_2_ = local_408.structPointerCount;
        local_868._46_1_ = local_408.elementSize;
        local_868._47_1_ = local_408._39_1_;
        local_868.nestingLimit = local_408.structDataSize;
        local_838 = CONCAT44(local_408._44_4_,local_408.nestingLimit);
        local_868.segment = (SegmentReader *)0x0;
        source_00._reader.pointers._4_4_ = local_3b8.step;
        source_00._reader.pointers._0_4_ = local_3b8.elementCount;
        source_00._reader.capTable = local_3b8.capTable;
        source_00._reader.segment = local_3b8.segment;
        source_00._reader.data = local_3b8.ptr;
        source_00._reader.dataSize = local_3b8.structDataSize;
        source_00._reader.pointerCount = local_3b8.structPointerCount;
        source_00._reader._38_1_ = local_3b8.elementSize;
        source_00._reader._39_1_ = local_3b8._39_1_;
        source_00._reader.nestingLimit = local_3b8.nestingLimit;
        source_00._reader._44_4_ = local_3b8._44_4_;
        auVar12._8_8_ = local_868.data;
        auVar12._0_8_ = local_868.capTable;
        auVar12._16_8_ = local_868.pointers;
        auVar12._24_4_ = local_408.elementCount;
        auVar12._28_2_ = (StructPointerCount)local_408.step;
        auVar12._30_2_ = (short)(local_408.step >> 0x10);
        auVar12._32_8_ = local_868._40_8_;
        auVar12._40_8_ = local_838;
        auVar12._48_8_ = 0;
        BrandScope::compileDeclExpression
                  ((Maybe<capnp::compiler::BrandedDecl> *)local_6f8,(this_00->localBrand).ptr,
                   source_00,this_00->resolver,(ImplicitParams)(auVar12 << 0x40));
        pRVar14 = local_2f0;
        local_618[0] = local_6f8[0];
        if (local_6f8[0] == true) {
          BStack_610.body.tag = local_6f8._8_4_;
          if (local_6f8._8_4_ == 2) {
            BStack_610.body.field_1._0_4_ = local_6f8._16_4_;
            BStack_610.body.field_1._4_4_ = local_6f8._20_4_;
            BStack_610.body.field_1._8_4_ = local_6f8._24_4_;
            BStack_610.body.field_1._12_4_ = local_6f8._28_4_;
          }
          else if (local_6f8._8_4_ == 1) {
            BStack_610.body.field_1._32_4_ = local_6f8._48_4_;
            BStack_610.body.field_1._36_4_ = local_6f8._52_4_;
            BStack_610.body.field_1._16_4_ = local_6f8._32_4_;
            BStack_610.body.field_1._20_2_ = (undefined2)local_6f8._36_4_;
            BStack_610.body.field_1._22_2_ = SUB42(local_6f8._36_4_,2);
            BStack_610.body.field_1._24_4_ = local_6f8._40_4_;
            BStack_610.body.field_1._28_4_ = local_6f8._44_4_;
            BStack_610.body.field_1._0_4_ = local_6f8._16_4_;
            BStack_610.body.field_1._4_4_ = local_6f8._20_4_;
            BStack_610.body.field_1._8_4_ = local_6f8._24_4_;
            BStack_610.body.field_1._12_4_ = local_6f8._28_4_;
            BStack_610.body.field_1.space[0x28] = local_6f8[0x38];
            if (local_6f8[0x38] == '\x01') {
              BStack_610.body.field_1._80_8_ = aSStack_6b0[3]._vptr_StructOrGroup;
              BStack_610.body.field_1._88_8_ = aSStack_6b0[4]._vptr_StructOrGroup;
              BStack_610.body.field_1._64_6_ = SUB86(aSStack_6b0[1]._vptr_StructOrGroup,0);
              BStack_610.body.field_1._70_2_ =
                   (undefined2)((ulong)aSStack_6b0[1]._vptr_StructOrGroup >> 0x30);
              BStack_610.body.field_1._72_8_ = aSStack_6b0[2]._vptr_StructOrGroup;
              BStack_610.body.field_1._48_8_ = local_6f8._64_8_;
              BStack_610.body.field_1._56_6_ = SUB86(aSStack_6b0[0]._vptr_StructOrGroup,0);
              BStack_610.body.field_1._62_2_ =
                   (undefined2)((ulong)aSStack_6b0[0]._vptr_StructOrGroup >> 0x30);
              local_6f8._56_8_ = local_6f8._56_8_ & 0xffffffffffffff00;
            }
          }
          BStack_610.brand.disposer = (Disposer *)local_688.nextChunkSize;
          BStack_610.brand.ptr = (BrandScope *)local_688.chunkList;
          local_688.chunkList = (ChunkHeader *)0x0;
          pSVar8 = (SegmentReader *)*local_2e8;
          pCVar9 = (ChunkHeader *)local_2e8[1];
          pvVar10 = local_2e8[2];
          pWVar53 = (WirePointer *)local_2e8[3];
          uVar66 = local_2e8[4];
          uVar76 = local_2e8[5];
          (pRVar14->_reader).dataSize = (int)uVar66;
          (pRVar14->_reader).pointerCount = (short)((ulong)uVar66 >> 0x20);
          *(short *)&(pRVar14->_reader).field_0x26 = (short)((ulong)uVar66 >> 0x30);
          *(undefined8 *)&(pRVar14->_reader).nestingLimit = uVar76;
          (pRVar14->_reader).data = pvVar10;
          (pRVar14->_reader).pointers = pWVar53;
          (pRVar14->_reader).segment = pSVar8;
          (pRVar14->_reader).capTable = (CapTableReader *)pCVar9;
          if (local_6f8._8_4_ == 1) {
            local_6f8._8_4_ = 0;
          }
          if (local_6f8._8_4_ == 2) {
            local_6f8._8_4_ = 0;
          }
        }
        if (local_6f8[0] == true) {
          BrandedDecl::getKind(&BStack_610);
          if (local_6f8[0] != true) {
            uVar58 = 0;
            uVar69 = 0;
            if (0x3f < BStack_610.source._reader.dataSize) {
              uVar69 = (ulong)*(uint *)(CONCAT44(BStack_610.source._reader.data._4_4_,
                                                 (int)BStack_610.source._reader.data) + 4);
            }
            if (0x9f < BStack_610.source._reader.dataSize) {
              uVar58 = (ulong)*(uint *)(CONCAT44(BStack_610.source._reader.data._4_4_,
                                                 (int)BStack_610.source._reader.data) + 0x10);
            }
            pSVar64 = (SegmentBuilder *)0x8b;
            (**this_00->errorReporter->_vptr_ErrorReporter)
                      (this_00->errorReporter,uVar69,uVar58,
                       "Cannot use generic parameter as whole input or output of a method. Instead, use a parameter/result list containing a field with this type."
                      );
            goto LAB_00167872;
          }
          if (local_6f8._2_2_ != 5) {
            local_868.capTable = (CapTableReader *)pSVar57;
            local_868.data = pBVar81;
            local_868.segment = &pSVar47->super_SegmentReader;
            iVar35 = iVar60;
            if (CONCAT11(uVar79,uVar77) == 0) {
              local_868.capTable = (CapTableReader *)(SegmentBuilder *)0x0;
              local_868.data = (BrandScope *)0x0;
              local_868.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
              iVar35 = 0x7fffffff;
            }
            uVar34 = SUB84(this_00->errorReporter,0);
            uVar55 = (uint)((ulong)this_00->errorReporter >> 0x20);
            local_868.pointers = (WirePointer *)CONCAT44(local_868.pointers._4_4_,iVar35);
            capnp::_::PointerReader::getStruct
                      ((StructReader *)local_6f8,(PointerReader *)&local_868,(word *)0x0);
            if (CONCAT11(uVar79,uVar77) == 0) {
              iVar60 = 0x7fffffff;
              pSVar57 = (SegmentBuilder *)0x0;
              pBVar81 = (BrandScope *)0x0;
              pSVar47 = (SegmentBuilder *)0x0;
            }
            local_828._24_4_ = iVar60;
            local_828._0_8_ = pSVar47;
            local_828._8_8_ = pSVar57;
            local_828._16_8_ = pBVar81;
            capnp::_::PointerReader::getStruct(&local_868,(PointerReader *)local_828,(word *)0x0);
            name._reader.segment._1_1_ = uVar79;
            name._reader.segment._0_1_ = uVar77;
            name._reader.segment._2_6_ = in_stack_fffffffffffff742;
            name._reader.capTable._0_4_ = uVar80;
            name._reader.capTable._4_4_ = iVar36;
            name._reader.data = pSVar49;
            name._reader.pointers._0_4_ = uVar34;
            name._reader.pointers._4_4_ = uVar55;
            name._reader._32_8_ = p_Var50;
            name._reader._40_8_ = in_stack_fffffffffffff768;
            pSVar57 = (SegmentBuilder *)local_868.segment;
            pSVar75 = (SegmentBuilder *)local_868.capTable;
            pBVar81 = (BrandScope *)local_868.data;
            pBVar54 = (BrandScope *)local_868.pointers;
            uVar66 = local_868._32_8_;
            uVar76 = local_868._40_8_;
            expressionString(name);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)&local_788,(kj *)0x2223ec,(char (*) [2])&stack0xfffffffffffff768,
                       (String *)"\' is not a struct type.",(char (*) [24])pSVar64);
            pSVar47 = (SegmentBuilder *)0x237f1b;
            if ((SegmentBuilder *)local_788.capTable != (SegmentBuilder *)0x0) {
              pSVar47 = local_788.segment;
            }
            pSVar64 = (SegmentBuilder *)
                      ((long)&((SegmentReader *)&(local_788.capTable)->super_CapTableReader)->arena
                      + (ulong)((SegmentBuilder *)local_788.capTable == (SegmentBuilder *)0x0));
            uVar33 = 0;
            uVar51 = 0;
            if (0x3f < (uint)local_6f8._32_4_) {
              uVar51 = *(undefined4 *)(CONCAT44(local_6f8._20_4_,local_6f8._16_4_) + 4);
            }
            if (0x9f < (uint)local_6f8._32_4_) {
              uVar33 = *(undefined4 *)(CONCAT44(local_6f8._20_4_,local_6f8._16_4_) + 0x10);
            }
            (*(code *)**(undefined8 **)CONCAT44(uVar55,uVar34))
                      ((undefined8 *)CONCAT44(uVar55,uVar34),uVar51,uVar33,pSVar47);
            pSVar65 = (SegmentBuilder *)local_788.capTable;
            pSVar47 = local_788.segment;
            pSVar82 = in_stack_fffffffffffff768;
            if (local_788.segment != (SegmentBuilder *)0x0) {
              local_788.segment = (SegmentBuilder *)0x0;
              local_788.capTable = (CapTableBuilder *)0x0;
              (*(code *)((SegmentReader *)local_788.ptr)->arena->_vptr_Arena)
                        (local_788.ptr,pSVar47,1,pSVar65,pSVar65,0,pSVar57,pSVar75,pBVar81,pBVar54,
                         uVar66,uVar76);
              pSVar64 = pSVar65;
              pSVar82 = in_stack_fffffffffffff768;
            }
            p_Var40 = (_Base_ptr)((ulong)uVar55 << 0x20);
            in_stack_fffffffffffff768 = pSVar82;
            if (pSVar82 != (SegmentBuilder *)0x0) {
              in_stack_fffffffffffff768 = (SegmentBuilder *)0x0;
              pSStack_890 = (SegmentBuilder *)0x0;
              (**(local_888->super_Refcounted).super_Disposer._vptr_Disposer)(local_888,pSVar82,1);
              p_Var40 = (_Base_ptr)((ulong)uVar55 << 0x20);
              pSVar64 = pSVar56;
            }
            goto LAB_00167872;
          }
          local_868.segment =
               (SegmentReader *)CONCAT71(local_868.segment._1_7_,BStack_610.body.tag == 1);
          if (BStack_610.body.tag != 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)local_6f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                       ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                       (DebugExpression<bool> *)&local_868);
            kj::_::Debug::Fault::fatal((Fault *)local_6f8);
          }
          local_7f8.segment = (SegmentBuilder *)0x0;
          local_7f8.capTable = (CapTableBuilder *)0x0;
          local_7f8.data = (SegmentBuilder *)0x0;
          local_7f8.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
          uVar77 = SUB81(BStack_610.brand.ptr,0);
          uVar79 = (undefined1)((ulong)BStack_610.brand.ptr >> 8);
          in_stack_fffffffffffff742 = (undefined6)((ulong)BStack_610.brand.ptr >> 0x10);
          pBVar81 = BStack_610.brand.ptr;
          do {
            if (((pBVar81->params).size_ != 0) ||
               ((pBVar81->inherited == true && (pBVar81->leafParamCount != 0)))) {
              if (local_7f8.capTable == (CapTableBuilder *)local_7f8.data) {
                sVar61 = (long)local_7f8.data - (long)local_7f8.segment >> 2;
                if ((SegmentBuilder *)local_7f8.data == local_7f8.segment) {
                  sVar61 = 4;
                }
                kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                          ((Vector<capnp::compiler::BrandScope_*> *)&local_7f8,sVar61);
              }
              ((SegmentReader *)&(local_7f8.capTable)->super_CapTableReader)->arena =
                   (Arena *)pBVar81;
              local_7f8.capTable =
                   (CapTableBuilder *)
                   &((SegmentReader *)&(local_7f8.capTable)->super_CapTableReader)->id;
            }
            pBVar81 = (pBVar81->parent).ptr.ptr;
          } while (pBVar81 != (BrandScope *)0x0);
          if ((SegmentBuilder *)local_7f8.capTable != local_7f8.segment) {
            local_828._16_8_ = local_320.pointers + 2;
            local_828._0_8_ = local_320.segment;
            local_828._8_8_ = local_320.capTable;
            capnp::_::PointerBuilder::initStruct
                      ((StructBuilder *)&local_868,(PointerBuilder *)local_828,(StructSize)0x10000);
            local_828._0_8_ = local_868.segment;
            local_828._8_8_ = local_868.capTable;
            local_828._16_8_ = local_868.pointers;
            capnp::_::PointerBuilder::initStructList
                      ((ListBuilder *)local_6f8,(PointerBuilder *)local_828,
                       (ElementCount)
                       ((ulong)((long)local_7f8.capTable - (long)local_7f8.segment) >> 3),
                       (StructSize)0x10002);
            lVar45 = (long)local_7f8.capTable - (long)local_7f8.segment;
            if (lVar45 != 0) {
              uVar58 = lVar45 >> 3;
              uVar69 = 0;
              uVar34 = (undefined4)uVar58;
              iVar36 = (int)(lVar45 >> 0x23);
              do {
                capnp::_::ListBuilder::getStructElement
                          ((StructBuilder *)&local_868,(ListBuilder *)local_6f8,(ElementCount)uVar69
                          );
                pWVar53 = local_868.pointers;
                pCVar48 = local_868.capTable;
                uVar68 = uVar69 & 0xffffffff;
                pAVar6 = (&((local_7f8.segment)->super_SegmentReader).arena)[uVar68];
                (((Refcounted *)local_868.data)->super_Disposer)._vptr_Disposer =
                     pAVar6[5]._vptr_Arena;
                if (*(char *)((long)&pAVar6[6]._vptr_Arena + 4) == '\x01') {
                  *(undefined2 *)&((Refcounted *)local_868.data)->refcount = 1;
                }
                else {
                  EVar72 = *(ElementCount *)
                            &(&((local_7f8.segment)->super_SegmentReader).arena)[uVar68][8].
                             _vptr_Arena;
                  *(undefined2 *)&((Refcounted *)local_868.data)->refcount = 0;
                  pSStack_890 = (SegmentBuilder *)local_868.capTable;
                  local_888 = (BrandScope *)local_868.pointers;
                  in_stack_fffffffffffff768 = (SegmentBuilder *)local_868.segment;
                  capnp::_::PointerBuilder::initStructList
                            ((ListBuilder *)local_828,(PointerBuilder *)&stack0xfffffffffffff768,
                             EVar72,(StructSize)0x10001);
                  uVar58 = local_828._24_8_ & 0xffffffff;
                  if (uVar58 != 0) {
                    lVar45 = 0;
                    uVar71 = 0;
                    do {
                      pp_Var39 = (&((local_7f8.segment)->super_SegmentReader).arena)[uVar68][7].
                                 _vptr_Arena;
                      pEVar59 = *(ErrorReporter **)
                                 (CONCAT62(in_stack_fffffffffffff742,CONCAT11(uVar79,uVar77)) + 0x10
                                 );
                      capnp::_::ListBuilder::getStructElement
                                ((StructBuilder *)&stack0xfffffffffffff768,(ListBuilder *)local_828,
                                 (ElementCount)uVar71);
                      *(undefined2 *)
                       &(((Refcounted *)&pWVar53->offsetAndKind)->super_Disposer)._vptr_Disposer = 1
                      ;
                      local_750.capTable = (CapTableBuilder *)pCVar48;
                      local_750.data = pBStack_880;
                      local_750.segment = in_stack_fffffffffffff768;
                      capnp::_::PointerBuilder::initStruct
                                ((StructBuilder *)&local_788,(PointerBuilder *)&local_750,
                                 (StructSize)0x10003);
                      target_00._builder.pointers._4_4_ = local_788.step;
                      target_00._builder.pointers._0_4_ = local_788.elementCount;
                      target_00._builder.capTable = local_788.capTable;
                      target_00._builder.segment = local_788.segment;
                      target_00._builder.data = local_788.ptr;
                      target_00._builder.dataSize = local_788.structDataSize;
                      target_00._builder.pointerCount = local_788.structPointerCount;
                      target_00._builder._38_1_ = local_788.elementSize;
                      target_00._builder._39_1_ = local_788._39_1_;
                      BrandedDecl::compileAsType
                                ((BrandedDecl *)((long)pp_Var39 + lVar45),pEVar59,target_00);
                      uVar71 = uVar71 + 1;
                      lVar45 = lVar45 + 0xa8;
                    } while (uVar58 != uVar71);
                  }
                  uVar58 = CONCAT44(iVar36,uVar34);
                }
                p_Var40 = (_Base_ptr)CONCAT44(iVar36,uVar34);
                uVar69 = uVar69 + 1;
                this_00 = local_720;
              } while (uVar69 != uVar58);
            }
          }
          pvVar10 = local_7f8.data;
          pCVar16 = local_7f8.capTable;
          pSVar56 = local_7f8.segment;
          if (local_7f8.segment != (SegmentBuilder *)0x0) {
            local_7f8.segment = (SegmentBuilder *)0x0;
            local_7f8.capTable = (CapTableBuilder *)0x0;
            local_7f8.data = (SegmentBuilder *)0x0;
            pSVar64 = (SegmentBuilder *)((long)pvVar10 - (long)pSVar56 >> 3);
            (**(code **)*local_7f8.pointers)
                      (local_7f8.pointers,pSVar56,8,(long)pCVar16 - (long)pSVar56 >> 3);
          }
          pSVar56 = (SegmentBuilder *)
                    CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        }
        else {
LAB_00167872:
          pSVar56 = (SegmentBuilder *)0x0;
        }
        pBVar81 = BStack_610.brand.ptr;
        if (local_618[0] == _S_black) {
          if (BStack_610.brand.ptr != (BrandScope *)0x0) {
            BStack_610.brand.ptr = (BrandScope *)0x0;
            (**(BStack_610.brand.disposer)->_vptr_Disposer)
                      (BStack_610.brand.disposer,
                       (pBVar81->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                       (long)&(pBVar81->super_Refcounted).super_Disposer._vptr_Disposer);
          }
          if (BStack_610.body.tag == 1) {
            BStack_610.body.tag = 0;
          }
          if (BStack_610.body.tag == 2) {
            BStack_610.body.tag = 0;
          }
        }
      }
      else {
        local_338 = (SegmentBuilder *)local_258.segment;
        if (sVar31 != 0) {
          kj::_::unreachable();
        }
        iVar36 = local_258.nestingLimit;
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_618,(this_00->orphanage).arena,
                   (this_00->orphanage).capTable,(StructSize)0x60006);
        local_3d8.segment = (SegmentBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
        local_3d8.capTable =
             (CapTableBuilder *)
             CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        local_3d8.location =
             (word *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
        local_3d8.tag.content = (uint64_t)local_618;
        pAVar46 = (ArrayPtr<const_char> *)0x20002;
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_618,(this_00->orphanage).arena,
                   (this_00->orphanage).capTable,(StructSize)0x20002);
        local_718.segment = (SegmentBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
        local_718.capTable =
             (CapTableBuilder *)
             CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        local_718.location =
             (word *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
        local_718.tag.content = (uint64_t)local_618;
        capnp::_::OrphanBuilder::asStruct(&local_750,&local_3d8,(StructSize)0x60006);
        capnp::_::OrphanBuilder::asStructReader(&local_868,local_298,(StructSize)0x60006);
        BStack_610.body._0_8_ = RVar74.super_StringPtr.content.size_ - 1;
        local_6f8[0] = true;
        local_6f8[1] = 0x2a;
        local_6f8._2_2_ = 0x22;
        local_6f8._4_4_ = 0;
        local_6f8._8_4_ = 7;
        local_6f8._12_4_ = 0;
        local_618 = (undefined1  [8])RVar74.super_StringPtr.content.ptr;
        kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  (&local_458,(_ *)local_618,(ArrayPtr<const_char> *)local_6f8,pAVar46);
        if (local_868.dataSize < 0x40) {
          pp_Var39 = (_func_int **)0x0;
        }
        else {
          pp_Var39 = (((Refcounted *)local_868.data)->super_Disposer)._vptr_Disposer;
        }
        pp_Var39 = (_func_int **)
                   generateMethodParamsId((uint64_t)pp_Var39,(uint16_t)local_728,false);
        (((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer = pp_Var39;
        if (local_868.pointerCount == 0) {
          BStack_610.body.field_1._8_4_ = 0x7fffffff;
          pSVar56 = (SegmentBuilder *)0x0;
          pBVar54 = (BrandScope *)0x0;
          local_618 = (undefined1  [8])0x0;
        }
        else {
          pSVar56 = (SegmentBuilder *)local_868.capTable;
          pBVar54 = (BrandScope *)local_868.pointers;
          local_618 = (undefined1  [8])local_868.segment;
          BStack_610.body.field_1._8_4_ = local_868.nestingLimit;
        }
        BStack_610.body.tag = (uint)pSVar56;
        BStack_610.body._4_4_ = SUB84((ulong)pSVar56 >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(pBVar54,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pBVar54 >> 0x20);
        RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_618,(void *)0x0,0);
        local_618 = RVar74.super_StringPtr.content.ptr;
        BStack_610.body._0_8_ = RVar74.super_StringPtr.content.size_ - 1;
        local_828[0] = 0x2e;
        local_3b8.segment = (SegmentReader *)local_458.content.size_;
        if ((SegmentBuilder *)local_458.content.size_ != (SegmentBuilder *)0x0) {
          local_3b8.segment = (SegmentReader *)local_458.content.ptr;
        }
        local_3b8.capTable = (CapTableReader *)(SegmentBuilder *)0x0;
        if ((SegmentBuilder *)local_458.content.size_ != (SegmentBuilder *)0x0) {
          local_3b8.capTable =
               (CapTableReader *)&((SegmentBuilder *)(local_458.content.size_ + -0x38))->field_0x37;
        }
        kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                  ((String *)local_6f8,(_ *)local_618,(ArrayPtr<const_char> *)local_828,
                   (FixedArray<char,_1UL> *)&local_3b8,(ArrayPtr<const_char> *)pSVar64);
        lVar45 = CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
        pcVar63 = "";
        if (lVar45 != 0) {
          pcVar63 = (char *)CONCAT44(local_6f8._4_4_,
                                     CONCAT22(local_6f8._2_2_,CONCAT11(local_6f8[1],local_6f8[0])));
        }
        RVar74.super_StringPtr.content.size_ = lVar45 + (ulong)(lVar45 == 0);
        local_618 = (undefined1  [8])local_750.segment;
        BStack_610.body.tag = (uint)local_750.capTable;
        BStack_610.body._4_4_ = SUB84((ulong)local_750.capTable >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(local_750.pointers,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)local_750.pointers >> 0x20);
        RVar74.super_StringPtr.content.ptr = pcVar63;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_618,RVar74);
        lVar45 = CONCAT44(local_6f8._4_4_,
                          CONCAT22(local_6f8._2_2_,CONCAT11(local_6f8[1],local_6f8[0])));
        if (lVar45 != 0) {
          pSVar64 = (SegmentBuilder *)CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
          local_6f8[0] = false;
          local_6f8[1] = 0;
          local_6f8._2_2_ = 0;
          local_6f8._4_4_ = 0;
          local_6f8._8_4_ = 0;
          local_6f8._12_4_ = 0;
          (*(code *)**(undefined8 **)CONCAT44(local_6f8._20_4_,local_6f8._16_4_))
                    ((undefined8 *)CONCAT44(local_6f8._20_4_,local_6f8._16_4_),lVar45,1);
        }
        local_618 = (undefined1  [8])local_750.segment;
        BStack_610.body.tag = (uint)local_750.capTable;
        BStack_610.body._4_4_ = SUB84((ulong)local_750.capTable >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(local_750.pointers,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)local_750.pointers >> 0x20);
        capnp::_::PointerBuilder::getBlob<capnp::Text>
                  ((Builder *)local_6f8,(PointerBuilder *)local_618,(void *)0x0,0);
        uVar42 = 0;
        if ((SegmentBuilder *)local_458.content.size_ != (SegmentBuilder *)0x0) {
          uVar42 = (int)local_458.content.size_ - 1;
        }
        ((Refcounted *)local_750.data)->refcount = ~uVar42 + local_6f8._16_4_;
        if ((local_868.dataSize < 0x121) ||
           (bVar73 = true,
           ((ulong)(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                    ((long)local_868.data + 0x18))->ptr).ptr & 0x100000000) == 0)) {
          bVar73 = local_408.elementCount != 0;
        }
        *(byte *)((long)&(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                          ((long)local_750.data + 0x18))->ptr).ptr + 4) =
             *(byte *)((long)&(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                               ((long)local_750.data + 0x18))->ptr).ptr + 4) & 0xfe | bVar73;
        *(ErrorReporter **)((long)local_750.data + 0x10) = (ErrorReporter *)0x0;
        uVar34 = 0;
        aVar52.upper32Bits = 0;
        if (0x3f < SVar30) {
          aVar52 = *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pvVar10 + 4);
        }
        *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_750.data + 0x28) = aVar52;
        if (0x5f < SVar30) {
          uVar34 = *(undefined4 *)((long)pvVar10 + 8);
        }
        *(undefined4 *)((long)((long)local_750.data + 0x28) + 4) = uVar34;
        *(undefined4 *)&((Refcounted *)local_750.data)->field_0xc = 1;
        *(undefined4 *)
         &(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
           ((long)local_750.data + 0x18))->ptr).disposer = 0;
        pbVar1 = (byte *)((long)&(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                                  ((long)local_750.data + 0x18))->ptr).disposer + 4);
        *pbVar1 = *pbVar1 & 0xfe;
        *(undefined2 *)
         ((long)&(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                  ((long)local_750.data + 0x18))->ptr).disposer + 6) = 0;
        *(undefined4 *)
         &(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
           ((long)local_750.data + 0x18))->ptr).ptr = 0;
        BStack_610.body.field_1._0_8_ =
             &(((SegmentReader *)&(local_750.pointers)->offsetAndKind)->ptr).size_;
        local_618 = (undefined1  [8])local_750.segment;
        BStack_610.body.tag = (uint)local_750.capTable;
        BStack_610.body._4_4_ = SUB84((ulong)local_750.capTable >> 0x20,0);
        capnp::_::PointerBuilder::clear((PointerBuilder *)local_618);
        capnp::_::OrphanBuilder::asStruct((StructBuilder *)local_618,&local_718,(StructSize)0x20002)
        ;
        uVar43 = 0;
        *(_func_int ***)BStack_610.body.field_1._0_8_ =
             (((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer;
        aVar52.upper32Bits = 0;
        if (0x3f < SVar30) {
          aVar52 = *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pvVar10 + 4);
        }
        (((WirePointer *)(BStack_610.body.field_1._0_8_ + 8))->offsetAndKind).value = (uint)aVar52;
        if (0x5f < SVar30) {
          uVar43 = *(uint32_t *)((long)pvVar10 + 8);
        }
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(BStack_610.body.field_1._0_8_ + 0xc))->
        upper32Bits = uVar43;
        pp_Var39 = (((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer;
        local_6f8._56_8_ = CONCAT44(local_408._36_4_,local_408.structDataSize);
        local_6f8._64_8_ = CONCAT44(local_408._44_4_,local_408.nestingLimit);
        local_6f8._40_4_ = (uint)local_408.ptr;
        local_6f8._44_4_ = local_408.ptr._4_4_;
        local_6f8._48_4_ = local_408.elementCount;
        local_6f8._52_4_ = local_408.step;
        local_6f8._24_4_ = (uint)local_408.segment;
        local_6f8._28_4_ = local_408.segment._4_4_;
        local_6f8._32_4_ = (uint)local_408.capTable;
        local_6f8._36_4_ = local_408.capTable._4_4_;
        local_6f8[0] = SUB81(this_00,0);
        local_6f8[1] = (undefined1)((ulong)this_00 >> 8);
        local_6f8._2_2_ = (undefined2)((ulong)this_00 >> 0x10);
        local_6f8._4_4_ = (undefined4)((ulong)this_00 >> 0x20);
        local_6f8._8_4_ = SUB84(this_00->errorReporter,0);
        local_6f8._12_4_ = (undefined4)((ulong)this_00->errorReporter >> 0x20);
        local_6f8._16_4_ = SUB84(pp_Var39,0);
        local_6f8._20_4_ = (undefined4)((ulong)pp_Var39 >> 0x20);
        aSStack_6b0[0]._vptr_StructOrGroup = (_func_int **)&PTR_addVoid_0028c0c0;
        aSStack_6b0[3]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_6b0[4]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_6b0[1]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_6b0[2]._vptr_StructOrGroup = (_func_int **)0x0;
        kj::Arena::Arena(&local_688,0x400);
        psVar28 = local_2a8;
        local_668._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_668._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_668._M_impl.super__Rb_tree_header._M_header._M_left = local_2a0;
        local_668._M_impl.super__Rb_tree_header._M_header._M_right = local_2a0;
        local_2a8[2] = 0;
        psVar28[3] = 0;
        *psVar28 = 0;
        psVar28[1] = 0;
        local_620 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        local_618 = (undefined1  [8])local_338;
        if (CONCAT11(uVar79,uVar77) == 0) {
          iVar36 = 0x7fffffff;
          pSVar57 = (SegmentBuilder *)0x0;
          pBVar81 = (BrandScope *)0x0;
          local_618 = (undefined1  [8])0x0;
        }
        BStack_610.body.tag = (uint)pSVar57;
        BStack_610.body._4_4_ = SUB84((ulong)pSVar57 >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(pBVar81,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pBVar81 >> 0x20);
        BStack_610.body.field_1._8_4_ = iVar36;
        capnp::_::PointerReader::getList
                  (&local_3b8,(PointerReader *)local_618,INLINE_COMPOSITE,(word *)0x0);
        local_228 = local_750.segment;
        pSStack_220 = (SegmentBuilder *)local_750.capTable;
        local_218 = (BrandScope *)local_750.data;
        pSStack_210 = (SegmentBuilder *)local_750.pointers;
        local_208 = local_750.dataSize;
        SStack_204 = local_750.pointerCount;
        EStack_202 = local_750._38_1_;
        uStack_201 = local_750._39_1_;
        capnp::_::OrphanBuilder::asStruct(&local_180,&local_718,(StructSize)0x20002);
        puVar26 = local_2b0;
        local_2b0[4] = local_180._32_8_;
        pWVar53 = local_180.pointers;
        pCVar16 = local_180.capTable;
        pSVar56 = local_180.segment;
        puVar26[2] = local_180.data;
        puVar26[3] = pWVar53;
        *puVar26 = pSVar56;
        puVar26[1] = pCVar16;
        pSVar57 = pSStack_210;
        pBVar81 = local_218;
        pSVar47 = pSStack_220;
        pSVar56 = local_228;
        puVar26 = local_2b8;
        local_828._0_8_ = local_228;
        local_828._8_8_ = pSStack_220;
        local_828._16_8_ = local_218;
        local_828._24_8_ = pSStack_210;
        local_828._32_4_ = local_208;
        local_828._36_2_ = SStack_204;
        local_828[0x26] = EStack_202;
        local_828[0x27] = uStack_201;
        local_2b8[4] = _local_208;
        puVar26[2] = pBVar81;
        puVar26[3] = pSVar57;
        *puVar26 = pSVar56;
        puVar26[1] = pSVar47;
        ppWVar27 = local_2c0;
        local_618 = (undefined1  [8])0x0;
        BStack_610.body.tag = 0;
        BStack_610.body._4_4_ = 0;
        BStack_610.body.field_1._0_4_ = 0;
        BStack_610.body.field_1._4_4_ = 0;
        BStack_610.body.field_1._8_4_ = 0;
        BStack_610.body.field_1._12_4_ = BStack_610.body.field_1._12_4_ & 0xffffff00;
        BStack_610.body.field_1._16_4_ = 0x237f1b;
        BStack_610.body.field_1._20_2_ = 0;
        BStack_610.body.field_1._22_2_ = 0;
        BStack_610.body.field_1._24_4_ = 1;
        BStack_610.body.field_1._28_4_ = 0;
        BStack_610.body.field_1._64_6_ = 0;
        BStack_610.body.field_1._48_8_ = 0;
        BStack_610.body.field_1._56_6_ = 0;
        BStack_610.body.field_1._62_2_ = 0;
        BStack_610.body.field_1._32_4_ = 0;
        BStack_610.body.field_1._36_4_ = 0;
        BStack_610.body.field_1._40_4_ = 0;
        BStack_610.body.field_1._44_4_ = 0;
        BStack_610.body.field_1._72_4_ = 0x7fffffff;
        BStack_610.body.field_1._82_2_ = 0;
        BStack_610.source._reader.capTable._0_4_ = 0;
        BStack_610.source._reader.capTable._4_2_ = 0;
        BStack_610.brand.ptr = (BrandScope *)0x0;
        BStack_610.source._reader.segment._0_6_ = 0;
        BStack_610.source._reader.segment._6_2_ = 0;
        BStack_610.body.field_1._88_8_ = 0;
        BStack_610.brand.disposer = (Disposer *)0x0;
        BStack_610.source._reader.data._0_4_ = 0x7fffffff;
        *(undefined8 *)((long)local_2c0 + 0x1e) = 0;
        ppWVar27[2] = (WirePointer *)0x0;
        ppWVar27[3] = (WirePointer *)0x0;
        *ppWVar27 = (WirePointer *)0x0;
        ppWVar27[1] = (WirePointer *)0x0;
        puVar26 = local_2c8;
        local_558 = 0x7fffffff;
        *(undefined8 *)((long)local_2c8 + 0x1e) = 0;
        puVar26[2] = 0;
        puVar26[3] = 0;
        *puVar26 = 0;
        puVar26[1] = 0;
        puVar26 = local_2d0;
        local_52a = INLINE_COMPOSITE;
        local_528 = 0x7fffffff;
        local_500 = false;
        *(undefined1 *)(local_2d0 + 1) = 0;
        *puVar26 = 0;
        local_480.fieldScope = (StructOrGroup *)0x0;
        params_00.reader.step = local_3b8.step;
        params_00.reader.elementCount = local_3b8.elementCount;
        params_00.reader.capTable = local_3b8.capTable;
        params_00.reader.segment = local_3b8.segment;
        params_00.reader.ptr = local_3b8.ptr;
        params_00.reader.structDataSize = local_3b8.structDataSize;
        params_00.reader.structPointerCount = local_3b8.structPointerCount;
        params_00.reader.elementSize = local_3b8.elementSize;
        params_00.reader._39_1_ = local_3b8._39_1_;
        params_00.reader.nestingLimit = local_3b8.nestingLimit;
        params_00.reader._44_4_ = local_3b8._44_4_;
        StructTranslator::traverseParams
                  ((StructTranslator *)local_6f8,params_00,(MemberInfo *)local_618,aSStack_6b0);
        builder_00._builder.capTable = (CapTableBuilder *)local_828._8_8_;
        builder_00._builder.segment = (SegmentBuilder *)local_828._0_8_;
        builder_00._builder.data = (void *)local_828._16_8_;
        builder_00._builder.pointers = (WirePointer *)local_828._24_8_;
        builder_00._builder.dataSize = local_828._32_4_;
        builder_00._builder.pointerCount = local_828._36_2_;
        builder_00._builder._38_2_ = local_828._38_2_;
        StructTranslator::translateInternal
                  ((StructTranslator *)local_6f8,(MemberInfo *)local_618,builder_00);
        pppMVar25 = local_2e0;
        ppMVar22 = ppMStack_628;
        ppMVar21 = local_630;
        ppMVar20 = ppMStack_638;
        if (ppMStack_638 != (MemberInfo **)0x0) {
          *local_2e0 = (MemberInfo **)0x0;
          pppMVar25[1] = (MemberInfo **)0x0;
          pppMVar25[2] = (MemberInfo **)0x0;
          pSVar64 = (SegmentBuilder *)((long)ppMVar22 - (long)ppMVar20 >> 3);
          (**local_620->_vptr_ArrayDisposer)
                    (local_620,ppMVar20,8,(long)ppMVar21 - (long)ppMVar20 >> 3);
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
        ::~_Rb_tree(local_2d8);
        kj::Arena::~Arena(&local_688);
        local_338 = (SegmentBuilder *)
                    (((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer;
        BStack_610.body.field_1._0_4_ = SUB84(local_3d8.capTable,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)local_3d8.capTable >> 0x20);
        BStack_610.body.field_1._8_4_ = SUB84(local_3d8.location,0);
        BStack_610.body.field_1._12_4_ = (undefined4)((ulong)local_3d8.location >> 0x20);
        local_618 = (undefined1  [8])local_3d8.tag.content;
        BStack_610.body.tag = (uint)local_3d8.segment;
        BStack_610.body._4_4_ = SUB84((ulong)local_3d8.segment >> 0x20,0);
        local_3d8.segment = (SegmentBuilder *)0x0;
        local_3d8.location = (word *)0x0;
        BStack_610.body.field_1._24_4_ = SUB84(local_718.segment,0);
        BStack_610.body.field_1._28_4_ = (undefined4)((ulong)local_718.segment >> 0x20);
        BStack_610.body.field_1._32_4_ = SUB84(local_718.capTable,0);
        BStack_610.body.field_1._36_4_ = (undefined4)((ulong)local_718.capTable >> 0x20);
        BStack_610.body.field_1._40_4_ = SUB84(local_718.location,0);
        BStack_610.body.field_1._44_4_ = (undefined4)((ulong)local_718.location >> 0x20);
        BStack_610.body.field_1._16_4_ = (undefined4)local_718.tag.content;
        BStack_610.body.field_1._20_2_ = (undefined2)(local_718.tag.content >> 0x20);
        BStack_610.body.field_1._22_2_ = (undefined2)(local_718.tag.content >> 0x30);
        local_718.segment = (SegmentBuilder *)0x0;
        local_718.location = (word *)0x0;
        pAVar4 = (this_00->paramStructs).builder.endPtr;
        if ((this_00->paramStructs).builder.pos == pAVar4) {
          sVar61 = (long)pAVar4 - (long)*(AuxNode **)&local_2f8->body >> 5;
          if (pAVar4 == *(AuxNode **)&local_2f8->body) {
            sVar61 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::setCapacity
                    ((Vector<capnp::compiler::NodeTranslator::AuxNode> *)local_2f8,sVar61);
        }
        pRVar5 = (this_00->paramStructs).builder.pos;
        (pRVar5->node).builder.segment =
             (SegmentBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
        (pRVar5->node).builder.capTable =
             (CapTableBuilder *)
             CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        (pRVar5->node).builder.location =
             (word *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
        (pRVar5->node).builder.tag.content = (uint64_t)local_618;
        BStack_610.body.tag = 0;
        BStack_610.body._4_4_ = 0;
        BStack_610.body.field_1._8_4_ = 0;
        BStack_610.body.field_1._12_4_ = 0;
        (pRVar5->sourceInfo).builder.segment =
             (SegmentBuilder *)
             CONCAT44(BStack_610.body.field_1._28_4_,BStack_610.body.field_1._24_4_);
        (pRVar5->sourceInfo).builder.capTable =
             (CapTableBuilder *)
             CONCAT44(BStack_610.body.field_1._36_4_,BStack_610.body.field_1._32_4_);
        (pRVar5->sourceInfo).builder.location =
             (word *)CONCAT44(BStack_610.body.field_1._44_4_,BStack_610.body.field_1._40_4_);
        (pRVar5->sourceInfo).builder.tag.content =
             CONCAT26(BStack_610.body.field_1._22_2_,
                      CONCAT24(BStack_610.body.field_1._20_2_,BStack_610.body.field_1._16_4_));
        BStack_610.body.field_1._24_4_ = 0;
        BStack_610.body.field_1._28_4_ = 0;
        BStack_610.body.field_1._40_4_ = 0;
        BStack_610.body.field_1._44_4_ = 0;
        ppRVar2 = &(this_00->paramStructs).builder.pos;
        *ppRVar2 = *ppRVar2 + 1;
        BrandScope::push((BrandScope *)local_760,(uint64_t)(this_00->localBrand).ptr,
                         (uint)(((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer);
        if ((ulong)local_408.elementCount != 0) {
          pSVar64 = (SegmentBuilder *)0x0;
          pSStack_890 = (SegmentBuilder *)
                        kj::_::HeapArrayDisposer::allocateImpl
                                  (0xa8,0,(ulong)local_408.elementCount,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
          pBStack_880 = (BrandScope *)&kj::_::HeapArrayDisposer::instance;
          BStack_610.body.field_1._0_8_ = (long)local_750.pointers + 0x28;
          local_618 = (undefined1  [8])local_750.segment;
          BStack_610.body.tag = (uint)local_750.capTable;
          BStack_610.body._4_4_ = SUB84((ulong)local_750.capTable >> 0x20,0);
          pSVar56 = pSStack_890;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_6f8,(PointerBuilder *)local_618,local_408.elementCount,
                     (StructSize)0x10000);
          uVar58 = (ulong)local_408.elementCount;
          if (uVar58 != 0) {
            uVar69 = 0;
            do {
              EVar72 = (ElementCount)uVar69;
              capnp::_::ListReader::getStructElement((StructReader *)local_618,&local_408,EVar72);
              *(undefined4 *)&(pSStack_890->super_SegmentReader).arena = 2;
              *(undefined8 *)&(pSStack_890->super_SegmentReader).id = 0;
              *(ElementCount *)&(pSStack_890->super_SegmentReader).ptr.ptr = EVar72;
              *(undefined8 *)&pSStack_890[1].readOnly = 0;
              pSStack_890[2].super_SegmentReader.arena = (Arena *)0x0;
              *(undefined8 *)&pSStack_890[2].super_SegmentReader.id = 0;
              pSStack_890[2].super_SegmentReader.ptr.ptr = (word *)0x0;
              pSStack_890[2].super_SegmentReader.ptr.size_ = 0;
              pSStack_890[2].super_SegmentReader.readLimiter = (ReadLimiter *)0x0;
              pSStack_890[2].pos = (word *)0x0;
              *(undefined8 *)&pSStack_890[2].readOnly = 0x7fffffff;
              pSStack_890 = pSStack_890 + 3;
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_828,(ListBuilder *)local_6f8,EVar72);
              if (BStack_610.body.field_1._20_2_ == 0) {
                local_788.elementCount = 0x7fffffff;
                local_788.capTable = (CapTableBuilder *)0x0;
                local_788.ptr = (byte *)0x0;
                local_788.segment = (SegmentBuilder *)0x0;
              }
              else {
                local_788.capTable =
                     (CapTableBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
                local_788.ptr =
                     (byte *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
                local_788.segment = (SegmentBuilder *)local_618;
                local_788.elementCount = BStack_610.body.field_1._24_4_;
              }
              RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                                 ((PointerReader *)&local_788,(void *)0x0,0);
              local_788.segment = (SegmentBuilder *)local_828._0_8_;
              local_788.capTable = (CapTableBuilder *)local_828._8_8_;
              local_788.ptr = (byte *)local_828._24_8_;
              capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_788,RVar74);
              uVar69 = uVar69 + 1;
            } while (uVar58 != uVar69);
          }
          pSStack_470 = (SegmentBuilder *)
                        (((long)pSStack_890 - (long)pSVar56 >> 3) * -0x30c30c30c30c30c3);
          local_468 = &kj::_::HeapArrayDisposer::instance;
          pSVar47 = (SegmentBuilder *)0x0;
          pSStack_890 = (SegmentBuilder *)0x0;
          local_888 = (BrandScope *)0x0;
          BStack_610.body.field_1._16_4_ = 0;
          BStack_610.body.field_1._20_2_ = 0;
          BStack_610.body.field_1._22_2_ = 0;
          BStack_610.body.field_1._28_4_ = 0;
          local_618 = (undefined1  [8])0x0;
          BStack_610.body.tag = 0;
          BStack_610.body._4_4_ = 0;
          BStack_610.body.field_1._0_4_ = 0;
          BStack_610.body.field_1._4_4_ = 0;
          BStack_610.body.field_1._8_4_ = 0;
          BStack_610.body.field_1._12_4_ = 0;
          BStack_610.body.field_1._24_4_ = 0x7fffffff;
          auVar11 = ZEXT1640(ZEXT816(0)) << 0x40;
          source_01._reader._40_8_ = 0x7fffffff;
          source_01._reader.segment = (SegmentReader *)auVar11._0_8_;
          source_01._reader.capTable = (CapTableReader *)auVar11._8_8_;
          source_01._reader.data = (void *)auVar11._16_8_;
          source_01._reader.pointers = (WirePointer *)auVar11._24_8_;
          source_01._reader.dataSize = auVar11._32_4_;
          source_01._reader.pointerCount = auVar11._36_2_;
          source_01._reader._38_2_ = auVar11._38_2_;
          local_478 = pSVar56;
          BrandScope::setParams
                    ((BrandScope *)local_330,(Array<capnp::compiler::BrandedDecl> *)local_758,
                     (Which)&local_478,source_01);
          plVar24 = local_328;
          if (local_328 != (long *)0x0) {
            local_328 = (long *)0x0;
            (**(code **)*(_func_int **)local_330)
                      (local_330,(long)plVar24 + *(long *)(*plVar24 + -0x10));
          }
          pSVar57 = pSStack_470;
          pSVar56 = local_478;
          if (local_478 != (SegmentBuilder *)0x0) {
            local_478 = (SegmentBuilder *)0x0;
            pSStack_470 = (SegmentBuilder *)0x0;
            (**(code **)*local_468)(local_468,pSVar56,0xa8);
            pSVar64 = pSVar57;
          }
          in_stack_fffffffffffff768 = pSVar47;
          if (pSVar47 != (SegmentBuilder *)0x0) {
            in_stack_fffffffffffff768 = (SegmentBuilder *)0x0;
            pSStack_890 = (SegmentBuilder *)0x0;
            local_888 = (BrandScope *)0x0;
            pSVar64 = (SegmentBuilder *)((-(long)pSVar47 >> 3) * -0x30c30c30c30c30c3);
            kj::_::HeapArrayDisposer::disposeImpl
                      ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pSVar47,0xa8,
                       (-(long)pSVar47 >> 3) * -0x30c30c30c30c30c3,(size_t)pSVar64,
                       kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
          }
        }
        local_7c8.builder.ptr = (BrandScope **)0x0;
        local_7c8.builder.pos = (BrandScope **)0x0;
        local_7c8.builder.endPtr = (BrandScope **)0x0;
        local_7c8.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        uVar77 = SUB81(local_758,0);
        uVar79 = (undefined1)((ulong)local_758 >> 8);
        in_stack_fffffffffffff742 = (undefined6)((ulong)local_758 >> 0x10);
        pBVar81 = local_758;
        do {
          if (((pBVar81->params).size_ != 0) ||
             ((pBVar81->inherited == true && (pBVar81->leafParamCount != 0)))) {
            if (local_7c8.builder.pos == local_7c8.builder.endPtr) {
              sVar61 = (long)local_7c8.builder.endPtr - (long)local_7c8.builder.ptr >> 2;
              if (local_7c8.builder.endPtr == local_7c8.builder.ptr) {
                sVar61 = 4;
              }
              kj::Vector<capnp::compiler::BrandScope_*>::setCapacity(&local_7c8,sVar61);
            }
            *local_7c8.builder.pos = pBVar81;
            local_7c8.builder.pos = local_7c8.builder.pos + 1;
          }
          pBVar81 = (pBVar81->parent).ptr.ptr;
        } while (pBVar81 != (BrandScope *)0x0);
        if (local_7c8.builder.pos != local_7c8.builder.ptr) {
          local_788.ptr = (byte *)(local_320.pointers + 2);
          local_788.segment = local_320.segment;
          local_788.capTable = local_320.capTable;
          capnp::_::PointerBuilder::initStruct
                    ((StructBuilder *)local_828,(PointerBuilder *)&local_788,(StructSize)0x10000);
          local_788.segment = (SegmentBuilder *)local_828._0_8_;
          local_788.capTable = (CapTableBuilder *)local_828._8_8_;
          local_788.ptr = (byte *)local_828._24_8_;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_6f8,(PointerBuilder *)&local_788,
                     (ElementCount)
                     ((ulong)((long)local_7c8.builder.pos - (long)local_7c8.builder.ptr) >> 3),
                     (StructSize)0x10002);
          lVar45 = (long)local_7c8.builder.pos - (long)local_7c8.builder.ptr;
          if (lVar45 != 0) {
            uVar58 = lVar45 >> 3;
            uVar69 = 0;
            uVar34 = (undefined4)uVar58;
            uVar55 = (uint)(lVar45 >> 0x23);
            do {
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_828,(ListBuilder *)local_6f8,(ElementCount)uVar69);
              uVar68 = uVar69 & 0xffffffff;
              pBVar81 = local_7c8.builder.ptr[uVar68];
              (((Refcounted *)local_828._16_8_)->super_Disposer)._vptr_Disposer =
                   (_func_int **)pBVar81->leafId;
              if (pBVar81->inherited == true) {
                *(undefined2 *)&((Refcounted *)local_828._16_8_)->refcount = 1;
              }
              else {
                sVar61 = (local_7c8.builder.ptr[uVar68]->params).size_;
                *(undefined2 *)&((Refcounted *)local_828._16_8_)->refcount = 0;
                local_7f8.segment = (SegmentBuilder *)local_828._0_8_;
                local_7f8.capTable = (CapTableBuilder *)local_828._8_8_;
                local_7f8.data = (void *)local_828._24_8_;
                capnp::_::PointerBuilder::initStructList
                          (&local_788,(PointerBuilder *)&local_7f8,(ElementCount)sVar61,
                           (StructSize)0x10001);
                uVar58 = (ulong)local_788.elementCount;
                if (uVar58 != 0) {
                  lVar45 = 0;
                  uVar71 = 0;
                  do {
                    pBVar7 = (local_7c8.builder.ptr[uVar68]->params).ptr;
                    pEVar59 = *(ErrorReporter **)
                               (CONCAT62(in_stack_fffffffffffff742,CONCAT11(uVar79,uVar77)) + 0x10);
                    capnp::_::ListBuilder::getStructElement
                              (&local_7f8,&local_788,(ElementCount)uVar71);
                    *(undefined2 *)&((SegmentReader *)local_7f8.data)->arena = 1;
                    local_1c8.segment = local_7f8.segment;
                    local_1c8.capTable = local_7f8.capTable;
                    local_1c8.pointer = local_7f8.pointers;
                    capnp::_::PointerBuilder::initStruct
                              ((StructBuilder *)&stack0xfffffffffffff768,&local_1c8,
                               (StructSize)0x10003);
                    target_01._builder.capTable = (CapTableBuilder *)pSStack_890;
                    target_01._builder.segment = in_stack_fffffffffffff768;
                    target_01._builder.data = local_888;
                    target_01._builder.pointers = (WirePointer *)pBStack_880;
                    target_01._builder._32_8_ = local_878;
                    BrandedDecl::compileAsType
                              ((BrandedDecl *)((long)&(pBVar7->body).tag + lVar45),pEVar59,target_01
                              );
                    uVar71 = uVar71 + 1;
                    lVar45 = lVar45 + 0xa8;
                  } while (uVar58 != uVar71);
                }
                uVar58 = CONCAT44(uVar55,uVar34);
              }
              uVar69 = uVar69 + 1;
              this_00 = local_720;
            } while (uVar69 != uVar58);
          }
        }
        ppBVar19 = local_7c8.builder.endPtr;
        ppBVar18 = local_7c8.builder.pos;
        ppBVar17 = local_7c8.builder.ptr;
        if (local_7c8.builder.ptr != (BrandScope **)0x0) {
          local_7c8.builder.ptr = (BrandScope **)0x0;
          local_7c8.builder.pos = (BrandScope **)0x0;
          local_7c8.builder.endPtr = (BrandScope **)0x0;
          pSVar64 = (SegmentBuilder *)((long)ppBVar19 - (long)ppBVar17 >> 3);
          (**(local_7c8.builder.disposer)->_vptr_ArrayDisposer)
                    (local_7c8.builder.disposer,ppBVar17,8,(long)ppBVar18 - (long)ppBVar17 >> 3);
        }
        pBVar81 = local_758;
        if (local_758 != (BrandScope *)0x0) {
          local_758 = (BrandScope *)0x0;
          (**(code **)*(_func_int **)local_760)
                    (local_760,
                     (long)&(pBVar81->super_Refcounted).super_Disposer._vptr_Disposer +
                     *(long *)&((BrandedDecl *)
                               (pBVar81->super_Refcounted).super_Disposer._vptr_Disposer)[-1].source
                               ._reader.dataSize);
        }
        pSVar56 = (SegmentBuilder *)local_458.content.size_;
        pcVar63 = local_458.content.ptr;
        if ((SegmentBuilder *)local_458.content.ptr != (SegmentBuilder *)0x0) {
          local_458.content.ptr = (char *)0x0;
          local_458.content.size_ = 0;
          (**(local_458.content.disposer)->_vptr_ArrayDisposer)
                    (local_458.content.disposer,pcVar63,1);
          pSVar64 = pSVar56;
        }
        pSVar56 = local_338;
        if (local_718.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_718);
        }
        p_Var40 = (_Base_ptr)((ulong)uVar55 << 0x20);
        if (local_3d8.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_3d8);
          p_Var40 = (_Base_ptr)((ulong)uVar55 << 0x20);
        }
      }
LAB_001678d5:
      pSVar47 = pSStack_890;
      *(SegmentBuilder **)&((Refcounted *)local_320.data)->refcount = pSVar56;
      cVar78 = true;
      uVar55 = (ListElementCount)local_7a0;
      if (uVar80 < 0x70) {
        pBVar81 = (BrandScope *)0x0;
        psVar70 = (short *)0x0;
        local_8c8 = (SegmentBuilder *)0x0;
        uVar33 = 0;
        iVar36 = 0;
        uVar34 = 0;
        uVar51 = 0x7fffffff;
      }
      else if (*(short *)&(pSVar49->super_SegmentReader).field_0xc == 1) {
        if ((ushort)local_790 < 7) {
          local_6f8._24_4_ = 0x7fffffff;
          p_Var41 = (_Base_ptr)0x0;
          pp_Var37 = (_Base_ptr *)0x0;
          pSVar56 = (SegmentBuilder *)0x0;
        }
        else {
          pp_Var37 = &local_830[1]._M_left;
          p_Var41 = p_Var50;
          pSVar56 = local_798;
          local_6f8._24_4_ = (ListElementCount)local_7a0;
        }
        local_6f8[0] = SUB81(pSVar56,0);
        local_6f8[1] = (undefined1)((ulong)pSVar56 >> 8);
        local_6f8._2_2_ = (undefined2)((ulong)pSVar56 >> 0x10);
        local_6f8._4_4_ = (undefined4)((ulong)pSVar56 >> 0x20);
        local_6f8._8_4_ = SUB84(p_Var41,0);
        local_6f8._12_4_ = (undefined4)((ulong)p_Var41 >> 0x20);
        local_6f8._16_4_ = SUB84(pp_Var37,0);
        local_6f8._20_4_ = (undefined4)((ulong)pp_Var37 >> 0x20);
        capnp::_::PointerReader::getStruct
                  ((StructReader *)local_618,(PointerReader *)local_6f8,(word *)0x0);
        uVar33 = local_618._0_4_;
        iVar36 = local_618._4_4_;
        local_8c8 = (SegmentBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
        psVar70 = (short *)CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        pBVar81 = (BrandScope *)
                  CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
        cVar78 = BStack_610.body.field_1._20_2_ == 0;
        uVar34 = BStack_610.body.field_1._16_4_;
        uVar51 = BStack_610.body.field_1._24_4_;
      }
      else {
        pBVar81 = (BrandScope *)0x0;
        psVar70 = (short *)0x0;
        local_8c8 = (SegmentBuilder *)0x0;
        uVar33 = 0;
        iVar36 = 0;
        uVar34 = 0;
        uVar51 = 0x7fffffff;
      }
      uVar80 = (uint)((ulong)p_Var40 >> 0x20);
      p_Var40 = p_Var50;
      p_Var41 = local_830;
      local_618 = (undefined1  [8])local_798;
      if ((ushort)local_790 == 0) {
        p_Var40 = (_Base_ptr)0x0;
        p_Var41 = (_Base_ptr)0x0;
        local_618 = (undefined1  [8])(SegmentBuilder *)0x0;
        uVar55 = 0x7fffffff;
      }
      BStack_610.body.tag = (uint)p_Var40;
      BStack_610.body._4_4_ = SUB84((ulong)p_Var40 >> 0x20,0);
      BStack_610.body.field_1._0_4_ = SUB84(p_Var41,0);
      BStack_610.body.field_1._4_4_ = (undefined4)((ulong)p_Var41 >> 0x20);
      BStack_610.body.field_1._8_4_ = uVar55;
      capnp::_::PointerReader::getStruct(&local_1f8,(PointerReader *)local_618,(word *)0x0);
      pCVar48 = local_1f8.capTable;
      pWVar53 = local_1f8.pointers;
      local_618 = (undefined1  [8])local_1f8.segment;
      BStack_610.body.field_1._8_4_ = local_1f8.nestingLimit;
      if (local_1f8.pointerCount == 0) {
        pCVar48 = (CapTableReader *)0x0;
        pWVar53 = (WirePointer *)0x0;
        local_618 = (undefined1  [8])(SegmentBuilder *)0x0;
        BStack_610.body.field_1._8_4_ = 0x7fffffff;
      }
      BStack_610.body.tag = (uint)pCVar48;
      BStack_610.body._4_4_ = SUB84((ulong)pCVar48 >> 0x20,0);
      BStack_610.body.field_1._0_4_ = SUB84(pWVar53,0);
      BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pWVar53 >> 0x20);
      RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_618,(void *)0x0,0);
      local_408.structDataSize = local_418;
      local_408.structPointerCount = SStack_414;
      local_408.elementSize = EStack_412;
      local_408._39_1_ = uStack_411;
      local_408.nestingLimit = iStack_410;
      local_408._44_4_ = uStack_40c;
      local_408.ptr._0_4_ = local_438._16_4_;
      local_408.ptr._4_4_ = local_438._20_4_;
      local_408.elementCount = local_438._24_4_;
      local_408.step = uStack_41c;
      local_408.segment._0_4_ = local_438._0_4_;
      local_408.segment._4_4_ = local_438._4_4_;
      local_408.capTable._0_4_ = local_438._8_4_;
      local_408.capTable._4_4_ = local_438._12_4_;
      if ((uint)uVar34 < 0x10) {
        sVar31 = 0;
      }
      else {
        sVar31 = *psVar70;
      }
      if (sVar31 == 2) {
        (*this_00->resolver->_vptr_Resolver[8])
                  (local_618,this_00->resolver,"/capnp/stream.capnp",0x14);
        if (local_618[0] == _S_black) {
          if (BStack_610.body.field_1.space[0x20] == '\x01') {
            BStack_610.body.field_1._32_4_ = BStack_610.body.field_1._32_4_ & 0xffffff00;
          }
          (**(code **)(*(long *)CONCAT44(BStack_610.body.field_1._28_4_,
                                         BStack_610.body.field_1._24_4_) + 8))
                    (local_618,
                     (long *)CONCAT44(BStack_610.body.field_1._28_4_,BStack_610.body.field_1._24_4_)
                     ,"StreamResult");
          if (local_618[0] == _S_black) {
            pEVar59 = (ErrorReporter *)0x995f9a3377c0b16e;
            goto LAB_00169532;
          }
          uVar58 = 0;
          if (0x3f < (uint)uVar34) {
            uVar58 = (ulong)*(uint *)(psVar70 + 2);
          }
          pEVar59 = this_00->errorReporter;
          uVar66 = 0x96;
          pcVar63 = 
          "The version of \'/capnp/stream.capnp\' found in your import path does not appear to be the official one; it is missing the declaration of StreamResult."
          ;
        }
        else {
          uVar58 = 0;
          if (0x3f < (uint)uVar34) {
            uVar58 = (ulong)*(uint *)(psVar70 + 2);
          }
          pEVar59 = this_00->errorReporter;
          uVar66 = 0xb7;
          pcVar63 = 
          "A method declaration uses streaming, but \'/capnp/stream.capnp\' is not found in the import path. This is a standard file that should always be installed with the Cap\'n Proto compiler."
          ;
        }
        uVar69 = 0;
        if (0x5f < (uint)uVar34) {
          uVar69 = (ulong)*(uint *)(psVar70 + 4);
        }
        (**pEVar59->_vptr_ErrorReporter)(pEVar59,uVar58,uVar69,pcVar63,uVar66);
        pEVar59 = (ErrorReporter *)0x995f9a3377c0b16e;
      }
      else if (sVar31 == 1) {
        if (cVar78 == '\0') {
          local_868.segment = (SegmentReader *)CONCAT44(iVar36,uVar33);
          local_868.capTable = (CapTableReader *)local_8c8;
          local_868.data = pBVar81;
          uVar55 = uVar51;
        }
        else {
          local_868.segment = (SegmentReader *)0x0;
          local_868.capTable = (CapTableReader *)(SegmentBuilder *)0x0;
          local_868.data = (BrandScope *)0x0;
          uVar55 = 0x7fffffff;
        }
        local_868.pointers = (WirePointer *)CONCAT44(local_868.pointers._4_4_,uVar55);
        capnp::_::PointerReader::getStruct
                  ((StructReader *)&local_3b8,(PointerReader *)&local_868,(word *)0x0);
        local_868.capTable =
             (CapTableReader *)CONCAT44(local_408.segment._4_4_,(uint)local_408.segment);
        local_868.data = (void *)CONCAT44(local_408.capTable._4_4_,(uint)local_408.capTable);
        local_868.pointers = (WirePointer *)CONCAT44(local_408.ptr._4_4_,(uint)local_408.ptr);
        local_868._36_4_ = local_408.step;
        local_868.dataSize = local_408.elementCount;
        local_868._44_2_ = local_408.structPointerCount;
        local_868._46_1_ = local_408.elementSize;
        local_868._47_1_ = local_408._39_1_;
        local_868.nestingLimit = local_408.structDataSize;
        local_838 = CONCAT44(local_408._44_4_,local_408.nestingLimit);
        local_868.segment = (SegmentReader *)0x0;
        source_02._reader.pointers._4_4_ = local_3b8.step;
        source_02._reader.pointers._0_4_ = local_3b8.elementCount;
        source_02._reader.capTable = local_3b8.capTable;
        source_02._reader.segment = local_3b8.segment;
        source_02._reader.data = local_3b8.ptr;
        source_02._reader.dataSize = local_3b8.structDataSize;
        source_02._reader.pointerCount = local_3b8.structPointerCount;
        source_02._reader._38_1_ = local_3b8.elementSize;
        source_02._reader._39_1_ = local_3b8._39_1_;
        source_02._reader.nestingLimit = local_3b8.nestingLimit;
        source_02._reader._44_4_ = local_3b8._44_4_;
        auVar13._8_8_ = local_868.data;
        auVar13._0_8_ = local_868.capTable;
        auVar13._16_8_ = local_868.pointers;
        auVar13._24_4_ = local_408.elementCount;
        auVar13._28_2_ = (StructPointerCount)local_408.step;
        auVar13._30_2_ = (short)(local_408.step >> 0x10);
        auVar13._32_8_ = local_868._40_8_;
        auVar13._40_8_ = local_838;
        auVar13._48_8_ = 0;
        BrandScope::compileDeclExpression
                  ((Maybe<capnp::compiler::BrandedDecl> *)local_6f8,(this_00->localBrand).ptr,
                   source_02,this_00->resolver,(ImplicitParams)(auVar13 << 0x40));
        pRVar14 = local_2f0;
        local_618[0] = local_6f8[0];
        if (local_6f8[0] == true) {
          BStack_610.body.tag = local_6f8._8_4_;
          if (local_6f8._8_4_ == 2) {
            BStack_610.body.field_1._0_4_ = local_6f8._16_4_;
            BStack_610.body.field_1._4_4_ = local_6f8._20_4_;
            BStack_610.body.field_1._8_4_ = local_6f8._24_4_;
            BStack_610.body.field_1._12_4_ = local_6f8._28_4_;
          }
          else if (local_6f8._8_4_ == 1) {
            BStack_610.body.field_1._32_4_ = local_6f8._48_4_;
            BStack_610.body.field_1._36_4_ = local_6f8._52_4_;
            BStack_610.body.field_1._16_4_ = local_6f8._32_4_;
            BStack_610.body.field_1._20_2_ = (undefined2)local_6f8._36_4_;
            BStack_610.body.field_1._22_2_ = SUB42(local_6f8._36_4_,2);
            BStack_610.body.field_1._24_4_ = local_6f8._40_4_;
            BStack_610.body.field_1._28_4_ = local_6f8._44_4_;
            BStack_610.body.field_1._0_4_ = local_6f8._16_4_;
            BStack_610.body.field_1._4_4_ = local_6f8._20_4_;
            BStack_610.body.field_1._8_4_ = local_6f8._24_4_;
            BStack_610.body.field_1._12_4_ = local_6f8._28_4_;
            BStack_610.body.field_1.space[0x28] = local_6f8[0x38];
            if (local_6f8[0x38] == '\x01') {
              BStack_610.body.field_1._80_8_ = aSStack_6b0[3]._vptr_StructOrGroup;
              BStack_610.body.field_1._88_8_ = aSStack_6b0[4]._vptr_StructOrGroup;
              BStack_610.body.field_1._64_6_ = SUB86(aSStack_6b0[1]._vptr_StructOrGroup,0);
              BStack_610.body.field_1._70_2_ =
                   (undefined2)((ulong)aSStack_6b0[1]._vptr_StructOrGroup >> 0x30);
              BStack_610.body.field_1._72_8_ = aSStack_6b0[2]._vptr_StructOrGroup;
              BStack_610.body.field_1._48_8_ = local_6f8._64_8_;
              BStack_610.body.field_1._56_6_ = SUB86(aSStack_6b0[0]._vptr_StructOrGroup,0);
              BStack_610.body.field_1._62_2_ =
                   (undefined2)((ulong)aSStack_6b0[0]._vptr_StructOrGroup >> 0x30);
              local_6f8._56_8_ = local_6f8._56_8_ & 0xffffffffffffff00;
            }
          }
          BStack_610.brand.disposer = (Disposer *)local_688.nextChunkSize;
          BStack_610.brand.ptr = (BrandScope *)local_688.chunkList;
          local_688.chunkList = (ChunkHeader *)0x0;
          pSVar8 = (SegmentReader *)*local_2e8;
          pCVar9 = (ChunkHeader *)local_2e8[1];
          pvVar10 = local_2e8[2];
          pWVar53 = (WirePointer *)local_2e8[3];
          uVar66 = local_2e8[4];
          uVar76 = local_2e8[5];
          (pRVar14->_reader).dataSize = (int)uVar66;
          (pRVar14->_reader).pointerCount = (short)((ulong)uVar66 >> 0x20);
          *(short *)&(pRVar14->_reader).field_0x26 = (short)((ulong)uVar66 >> 0x30);
          *(undefined8 *)&(pRVar14->_reader).nestingLimit = uVar76;
          (pRVar14->_reader).data = pvVar10;
          (pRVar14->_reader).pointers = pWVar53;
          (pRVar14->_reader).segment = pSVar8;
          (pRVar14->_reader).capTable = (CapTableReader *)pCVar9;
          if (local_6f8._8_4_ == 1) {
            local_6f8._8_4_ = 0;
          }
          if (local_6f8._8_4_ == 2) {
            local_6f8._8_4_ = 0;
          }
        }
        if (local_6f8[0] == true) {
          BrandedDecl::getKind(&BStack_610);
          if (local_6f8[0] != true) {
            uVar58 = 0;
            uVar69 = 0;
            if (0x3f < BStack_610.source._reader.dataSize) {
              uVar69 = (ulong)*(uint *)(CONCAT44(BStack_610.source._reader.data._4_4_,
                                                 (int)BStack_610.source._reader.data) + 4);
            }
            if (0x9f < BStack_610.source._reader.dataSize) {
              uVar58 = (ulong)*(uint *)(CONCAT44(BStack_610.source._reader.data._4_4_,
                                                 (int)BStack_610.source._reader.data) + 0x10);
            }
            (**this_00->errorReporter->_vptr_ErrorReporter)
                      (this_00->errorReporter,uVar69,uVar58,
                       "Cannot use generic parameter as whole input or output of a method. Instead, use a parameter/result list containing a field with this type."
                       ,0x8b);
            goto LAB_001694cf;
          }
          if (local_6f8._2_2_ != 5) {
            if (cVar78 == '\0') {
              local_868.segment = (SegmentReader *)CONCAT44(iVar36,uVar33);
              local_868.capTable = (CapTableReader *)local_8c8;
              local_868.data = pBVar81;
              uVar55 = uVar51;
            }
            else {
              local_868.segment = (SegmentReader *)0x0;
              local_868.capTable = (CapTableReader *)(SegmentBuilder *)0x0;
              local_868.data = (BrandScope *)0x0;
              uVar55 = 0x7fffffff;
            }
            pEVar59 = this_00->errorReporter;
            local_868.pointers = (WirePointer *)CONCAT44(local_868.pointers._4_4_,uVar55);
            capnp::_::PointerReader::getStruct
                      ((StructReader *)local_6f8,(PointerReader *)&local_868,(word *)0x0);
            local_828._0_8_ = CONCAT44(iVar36,uVar33);
            local_828._16_8_ = pBVar81;
            uVar55 = uVar51;
            if (cVar78 != '\0') {
              uVar55 = 0x7fffffff;
              local_8c8 = (SegmentBuilder *)0x0;
              local_828._16_8_ = (BrandScope *)0x0;
              local_828._0_8_ = (SegmentBuilder *)0x0;
            }
            local_828._24_4_ = uVar55;
            local_828._8_8_ = local_8c8;
            capnp::_::PointerReader::getStruct(&local_868,(PointerReader *)local_828,(word *)0x0);
            name_00._reader.segment._1_1_ = uVar79;
            name_00._reader.segment._0_1_ = cVar78;
            name_00._reader.segment._2_6_ = in_stack_fffffffffffff742;
            name_00._reader.capTable._0_4_ = uVar33;
            name_00._reader.capTable._4_4_ = iVar36;
            name_00._reader.data = pBVar81;
            name_00._reader.pointers._0_4_ = uVar51;
            name_00._reader.pointers._4_4_ = uVar80;
            name_00._reader._32_8_ = p_Var50;
            name_00._reader._40_8_ = in_stack_fffffffffffff768;
            pSVar49 = (SegmentBuilder *)local_868.segment;
            pSVar57 = (SegmentBuilder *)local_868.capTable;
            pBVar81 = (BrandScope *)local_868.data;
            pBVar54 = (BrandScope *)local_868.pointers;
            uVar66 = local_868._32_8_;
            uVar76 = local_868._40_8_;
            expressionString(name_00);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)&local_788,(kj *)0x2223ec,(char (*) [2])&stack0xfffffffffffff768,
                       (String *)"\' is not a struct type.",(char (*) [24])pSVar64);
            pSVar56 = (SegmentBuilder *)0x237f1b;
            if ((SegmentBuilder *)local_788.capTable != (SegmentBuilder *)0x0) {
              pSVar56 = local_788.segment;
            }
            uVar58 = 0;
            uVar69 = 0;
            if (0x3f < (uint)local_6f8._32_4_) {
              uVar69 = (ulong)*(uint *)(CONCAT44(local_6f8._20_4_,local_6f8._16_4_) + 4);
            }
            if (0x9f < (uint)local_6f8._32_4_) {
              uVar58 = (ulong)*(uint *)(CONCAT44(local_6f8._20_4_,local_6f8._16_4_) + 0x10);
            }
            (**pEVar59->_vptr_ErrorReporter)
                      (pEVar59,uVar69,uVar58,pSVar56,
                       (char *)((long)&((SegmentReader *)&(local_788.capTable)->super_CapTableReader
                                       )->arena +
                               (ulong)((SegmentBuilder *)local_788.capTable == (SegmentBuilder *)0x0
                                      )));
            pCVar16 = local_788.capTable;
            pSVar56 = local_788.segment;
            pSVar64 = in_stack_fffffffffffff768;
            if (local_788.segment != (SegmentBuilder *)0x0) {
              local_788.segment = (SegmentBuilder *)0x0;
              local_788.capTable = (CapTableBuilder *)0x0;
              (*(code *)((SegmentReader *)local_788.ptr)->arena->_vptr_Arena)
                        (local_788.ptr,pSVar56,1,pCVar16,pCVar16,0,pSVar49,pSVar57,pBVar81,pBVar54,
                         uVar66,uVar76);
              pSVar64 = in_stack_fffffffffffff768;
            }
            in_stack_fffffffffffff768 = pSVar64;
            if (pSVar64 != (SegmentBuilder *)0x0) {
              in_stack_fffffffffffff768 = (SegmentBuilder *)0x0;
              pSStack_890 = (SegmentBuilder *)0x0;
              (**(local_888->super_Refcounted).super_Disposer._vptr_Disposer)
                        (local_888,pSVar64,1,pSVar47,pSVar47);
            }
            goto LAB_001694cf;
          }
          local_868.segment =
               (SegmentReader *)CONCAT71(local_868.segment._1_7_,BStack_610.body.tag == 1);
          if (BStack_610.body.tag != 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)local_6f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                       ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                       (DebugExpression<bool> *)&local_868);
            kj::_::Debug::Fault::fatal((Fault *)local_6f8);
          }
          local_7f8.segment = (SegmentBuilder *)0x0;
          local_7f8.capTable = (CapTableBuilder *)0x0;
          local_7f8.data = (SegmentBuilder *)0x0;
          local_7f8.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
          uVar77 = SUB81(BStack_610.brand.ptr,0);
          uVar79 = (undefined1)((ulong)BStack_610.brand.ptr >> 8);
          in_stack_fffffffffffff742 = (undefined6)((ulong)BStack_610.brand.ptr >> 0x10);
          pBVar81 = BStack_610.brand.ptr;
          do {
            if (((pBVar81->params).size_ != 0) ||
               ((pBVar81->inherited == true && (pBVar81->leafParamCount != 0)))) {
              if (local_7f8.capTable == (CapTableBuilder *)local_7f8.data) {
                sVar61 = (long)local_7f8.data - (long)local_7f8.segment >> 2;
                if ((SegmentBuilder *)local_7f8.data == local_7f8.segment) {
                  sVar61 = 4;
                }
                kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                          ((Vector<capnp::compiler::BrandScope_*> *)&local_7f8,sVar61);
              }
              ((SegmentReader *)&(local_7f8.capTable)->super_CapTableReader)->arena =
                   (Arena *)pBVar81;
              local_7f8.capTable =
                   (CapTableBuilder *)
                   &((SegmentReader *)&(local_7f8.capTable)->super_CapTableReader)->id;
            }
            pBVar81 = (pBVar81->parent).ptr.ptr;
          } while (pBVar81 != (BrandScope *)0x0);
          if ((SegmentBuilder *)local_7f8.capTable != local_7f8.segment) {
            local_828._16_8_ = local_320.pointers + 3;
            local_828._0_8_ = local_320.segment;
            local_828._8_8_ = local_320.capTable;
            capnp::_::PointerBuilder::initStruct
                      ((StructBuilder *)&local_868,(PointerBuilder *)local_828,(StructSize)0x10000);
            local_828._0_8_ = local_868.segment;
            local_828._8_8_ = local_868.capTable;
            local_828._16_8_ = local_868.pointers;
            capnp::_::PointerBuilder::initStructList
                      ((ListBuilder *)local_6f8,(PointerBuilder *)local_828,
                       (ElementCount)
                       ((ulong)((long)local_7f8.capTable - (long)local_7f8.segment) >> 3),
                       (StructSize)0x10002);
            lVar45 = (long)local_7f8.capTable - (long)local_7f8.segment;
            if (lVar45 != 0) {
              uVar58 = lVar45 >> 3;
              uVar69 = 0;
              uVar34 = (undefined4)uVar58;
              iVar36 = (int)(lVar45 >> 0x23);
              do {
                capnp::_::ListBuilder::getStructElement
                          ((StructBuilder *)&local_868,(ListBuilder *)local_6f8,(ElementCount)uVar69
                          );
                pWVar53 = local_868.pointers;
                pCVar48 = local_868.capTable;
                uVar68 = uVar69 & 0xffffffff;
                pAVar6 = (&((local_7f8.segment)->super_SegmentReader).arena)[uVar68];
                (((Refcounted *)local_868.data)->super_Disposer)._vptr_Disposer =
                     pAVar6[5]._vptr_Arena;
                if (*(char *)((long)&pAVar6[6]._vptr_Arena + 4) == '\x01') {
                  *(undefined2 *)&((Refcounted *)local_868.data)->refcount = 1;
                }
                else {
                  EVar72 = *(ElementCount *)
                            &(&((local_7f8.segment)->super_SegmentReader).arena)[uVar68][8].
                             _vptr_Arena;
                  *(undefined2 *)&((Refcounted *)local_868.data)->refcount = 0;
                  pSStack_890 = (SegmentBuilder *)local_868.capTable;
                  local_888 = (BrandScope *)local_868.pointers;
                  in_stack_fffffffffffff768 = (SegmentBuilder *)local_868.segment;
                  capnp::_::PointerBuilder::initStructList
                            ((ListBuilder *)local_828,(PointerBuilder *)&stack0xfffffffffffff768,
                             EVar72,(StructSize)0x10001);
                  uVar58 = local_828._24_8_ & 0xffffffff;
                  if (uVar58 != 0) {
                    lVar45 = 0;
                    uVar71 = 0;
                    do {
                      pp_Var39 = (&((local_7f8.segment)->super_SegmentReader).arena)[uVar68][7].
                                 _vptr_Arena;
                      pEVar59 = *(ErrorReporter **)
                                 (CONCAT62(in_stack_fffffffffffff742,CONCAT11(uVar79,uVar77)) + 0x10
                                 );
                      capnp::_::ListBuilder::getStructElement
                                ((StructBuilder *)&stack0xfffffffffffff768,(ListBuilder *)local_828,
                                 (ElementCount)uVar71);
                      *(undefined2 *)
                       &(((Refcounted *)&pWVar53->offsetAndKind)->super_Disposer)._vptr_Disposer = 1
                      ;
                      local_750.capTable = (CapTableBuilder *)pCVar48;
                      local_750.data = pBStack_880;
                      local_750.segment = in_stack_fffffffffffff768;
                      capnp::_::PointerBuilder::initStruct
                                ((StructBuilder *)&local_788,(PointerBuilder *)&local_750,
                                 (StructSize)0x10003);
                      target_02._builder.pointers._4_4_ = local_788.step;
                      target_02._builder.pointers._0_4_ = local_788.elementCount;
                      target_02._builder.capTable = local_788.capTable;
                      target_02._builder.segment = local_788.segment;
                      target_02._builder.data = local_788.ptr;
                      target_02._builder.dataSize = local_788.structDataSize;
                      target_02._builder.pointerCount = local_788.structPointerCount;
                      target_02._builder._38_1_ = local_788.elementSize;
                      target_02._builder._39_1_ = local_788._39_1_;
                      BrandedDecl::compileAsType
                                ((BrandedDecl *)((long)pp_Var39 + lVar45),pEVar59,target_02);
                      uVar71 = uVar71 + 1;
                      lVar45 = lVar45 + 0xa8;
                    } while (uVar58 != uVar71);
                  }
                  uVar58 = CONCAT44(iVar36,uVar34);
                }
                uVar69 = uVar69 + 1;
                this_00 = local_720;
              } while (uVar69 != uVar58);
            }
          }
          pvVar10 = local_7f8.data;
          pCVar16 = local_7f8.capTable;
          pSVar56 = local_7f8.segment;
          if (local_7f8.segment != (SegmentBuilder *)0x0) {
            local_7f8.segment = (SegmentBuilder *)0x0;
            local_7f8.capTable = (CapTableBuilder *)0x0;
            local_7f8.data = (SegmentBuilder *)0x0;
            (**(code **)*local_7f8.pointers)
                      (local_7f8.pointers,pSVar56,8,(long)pCVar16 - (long)pSVar56 >> 3,
                       (long)pvVar10 - (long)pSVar56 >> 3);
          }
          pEVar59 = (ErrorReporter *)
                    CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        }
        else {
LAB_001694cf:
          pEVar59 = (ErrorReporter *)0x0;
        }
        if ((local_618[0] == _S_black) && (BStack_610.brand.ptr != (BrandScope *)0x0)) {
          BStack_610.brand.ptr = (BrandScope *)0x0;
          (**(BStack_610.brand.disposer)->_vptr_Disposer)();
        }
      }
      else {
        if (sVar31 != 0) {
          kj::_::unreachable();
        }
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_618,(this_00->orphanage).arena,
                   (this_00->orphanage).capTable,(StructSize)0x60006);
        local_3d8.segment = (SegmentBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
        local_3d8.capTable =
             (CapTableBuilder *)
             CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        local_3d8.location =
             (word *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
        local_3d8.tag.content = (uint64_t)local_618;
        pAVar46 = (ArrayPtr<const_char> *)0x20002;
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_618,(this_00->orphanage).arena,
                   (this_00->orphanage).capTable,(StructSize)0x20002);
        local_718.segment = (SegmentBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
        local_718.capTable =
             (CapTableBuilder *)
             CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        local_718.location =
             (word *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
        local_718.tag.content = (uint64_t)local_618;
        capnp::_::OrphanBuilder::asStruct(&local_750,&local_3d8,(StructSize)0x60006);
        capnp::_::OrphanBuilder::asStructReader(&local_868,local_298,(StructSize)0x60006);
        BStack_610.body._0_8_ = RVar74.super_StringPtr.content.size_ - 1;
        local_6f8[0] = true;
        local_6f8[1] = 0x2a;
        local_6f8._2_2_ = 0x22;
        local_6f8._4_4_ = 0;
        local_6f8._8_4_ = 8;
        local_6f8._12_4_ = 0;
        local_618 = (undefined1  [8])RVar74.super_StringPtr.content.ptr;
        kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  (&local_458,(_ *)local_618,(ArrayPtr<const_char> *)local_6f8,pAVar46);
        pSVar56 = (SegmentBuilder *)CONCAT44(iVar36,uVar33);
        if (local_868.dataSize < 0x40) {
          pp_Var39 = (_func_int **)0x0;
        }
        else {
          pp_Var39 = (((Refcounted *)local_868.data)->super_Disposer)._vptr_Disposer;
        }
        pp_Var39 = (_func_int **)generateMethodParamsId((uint64_t)pp_Var39,(uint16_t)local_728,true)
        ;
        (((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer = pp_Var39;
        if (local_868.pointerCount == 0) {
          BStack_610.body.field_1._8_4_ = 0x7fffffff;
          pSVar49 = (SegmentBuilder *)0x0;
          pBVar54 = (BrandScope *)0x0;
          local_618 = (undefined1  [8])0x0;
        }
        else {
          pSVar49 = (SegmentBuilder *)local_868.capTable;
          pBVar54 = (BrandScope *)local_868.pointers;
          local_618 = (undefined1  [8])local_868.segment;
          BStack_610.body.field_1._8_4_ = local_868.nestingLimit;
        }
        BStack_610.body.tag = (uint)pSVar49;
        BStack_610.body._4_4_ = SUB84((ulong)pSVar49 >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(pBVar54,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pBVar54 >> 0x20);
        RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_618,(void *)0x0,0);
        local_618 = RVar74.super_StringPtr.content.ptr;
        BStack_610.body._0_8_ = RVar74.super_StringPtr.content.size_ - 1;
        local_828[0] = 0x2e;
        local_3b8.segment = (SegmentReader *)local_458.content.size_;
        if ((SegmentBuilder *)local_458.content.size_ != (SegmentBuilder *)0x0) {
          local_3b8.segment = (SegmentReader *)local_458.content.ptr;
        }
        local_3b8.capTable = (CapTableReader *)(SegmentBuilder *)0x0;
        if ((SegmentBuilder *)local_458.content.size_ != (SegmentBuilder *)0x0) {
          local_3b8.capTable =
               (CapTableReader *)&((SegmentBuilder *)(local_458.content.size_ + -0x38))->field_0x37;
        }
        kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                  ((String *)local_6f8,(_ *)local_618,(ArrayPtr<const_char> *)local_828,
                   (FixedArray<char,_1UL> *)&local_3b8,(ArrayPtr<const_char> *)pSVar64);
        lVar45 = CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
        pcVar63 = "";
        if (lVar45 != 0) {
          pcVar63 = (char *)CONCAT44(local_6f8._4_4_,
                                     CONCAT22(local_6f8._2_2_,CONCAT11(local_6f8[1],local_6f8[0])));
        }
        value.super_StringPtr.content.size_ = lVar45 + (ulong)(lVar45 == 0);
        local_618 = (undefined1  [8])local_750.segment;
        BStack_610.body.tag = (uint)local_750.capTable;
        BStack_610.body._4_4_ = SUB84((ulong)local_750.capTable >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(local_750.pointers,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)local_750.pointers >> 0x20);
        value.super_StringPtr.content.ptr = pcVar63;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_618,value);
        lVar45 = CONCAT44(local_6f8._4_4_,
                          CONCAT22(local_6f8._2_2_,CONCAT11(local_6f8[1],local_6f8[0])));
        if (lVar45 != 0) {
          local_6f8[0] = false;
          local_6f8[1] = 0;
          local_6f8._2_2_ = 0;
          local_6f8._4_4_ = 0;
          local_6f8._8_4_ = 0;
          local_6f8._12_4_ = 0;
          (*(code *)**(undefined8 **)CONCAT44(local_6f8._20_4_,local_6f8._16_4_))
                    ((undefined8 *)CONCAT44(local_6f8._20_4_,local_6f8._16_4_),lVar45,1);
        }
        local_618 = (undefined1  [8])local_750.segment;
        BStack_610.body.tag = (uint)local_750.capTable;
        BStack_610.body._4_4_ = SUB84((ulong)local_750.capTable >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(local_750.pointers,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)local_750.pointers >> 0x20);
        capnp::_::PointerBuilder::getBlob<capnp::Text>
                  ((Builder *)local_6f8,(PointerBuilder *)local_618,(void *)0x0,0);
        uVar55 = 0;
        if ((SegmentBuilder *)local_458.content.size_ != (SegmentBuilder *)0x0) {
          uVar55 = (int)local_458.content.size_ - 1;
        }
        ((Refcounted *)local_750.data)->refcount = ~uVar55 + local_6f8._16_4_;
        if ((local_868.dataSize < 0x121) ||
           (bVar73 = true,
           ((ulong)(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                    ((long)local_868.data + 0x18))->ptr).ptr & 0x100000000) == 0)) {
          bVar73 = local_408.elementCount != 0;
        }
        *(byte *)((long)&(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                          ((long)local_750.data + 0x18))->ptr).ptr + 4) =
             *(byte *)((long)&(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                               ((long)local_750.data + 0x18))->ptr).ptr + 4) & 0xfe | bVar73;
        *(ErrorReporter **)((long)local_750.data + 0x10) = (ErrorReporter *)0x0;
        uVar44 = 0;
        uVar33 = 0;
        if (0x3f < (uint)uVar34) {
          uVar33 = *(undefined4 *)(psVar70 + 2);
        }
        *(undefined4 *)((long)local_750.data + 0x28) = uVar33;
        if (0x5f < (uint)uVar34) {
          uVar44 = *(undefined4 *)(psVar70 + 4);
        }
        *(undefined4 *)((long)((long)local_750.data + 0x28) + 4) = uVar44;
        *(undefined4 *)&((Refcounted *)local_750.data)->field_0xc = 1;
        *(undefined4 *)
         &(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
           ((long)local_750.data + 0x18))->ptr).disposer = 0;
        pbVar1 = (byte *)((long)&(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                                  ((long)local_750.data + 0x18))->ptr).disposer + 4);
        *pbVar1 = *pbVar1 & 0xfe;
        *(undefined2 *)
         ((long)&(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                  ((long)local_750.data + 0x18))->ptr).disposer + 6) = 0;
        *(undefined4 *)
         &(((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
           ((long)local_750.data + 0x18))->ptr).ptr = 0;
        BStack_610.body.field_1._0_8_ =
             &(((SegmentReader *)&(local_750.pointers)->offsetAndKind)->ptr).size_;
        local_618 = (undefined1  [8])local_750.segment;
        BStack_610.body.tag = (uint)local_750.capTable;
        BStack_610.body._4_4_ = SUB84((ulong)local_750.capTable >> 0x20,0);
        capnp::_::PointerBuilder::clear((PointerBuilder *)local_618);
        capnp::_::OrphanBuilder::asStruct((StructBuilder *)local_618,&local_718,(StructSize)0x20002)
        ;
        uVar43 = 0;
        *(_func_int ***)BStack_610.body.field_1._0_8_ =
             (((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer;
        uVar55 = 0;
        if (0x3f < (uint)uVar34) {
          uVar55 = *(uint *)(psVar70 + 2);
        }
        (((WirePointer *)(BStack_610.body.field_1._0_8_ + 8))->offsetAndKind).value = uVar55;
        if (0x5f < (uint)uVar34) {
          uVar43 = *(uint32_t *)(psVar70 + 4);
        }
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(BStack_610.body.field_1._0_8_ + 0xc))->
        upper32Bits = uVar43;
        pp_Var39 = (((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer;
        local_6f8._56_8_ = CONCAT44(local_408._36_4_,local_408.structDataSize);
        local_6f8._64_8_ = CONCAT44(local_408._44_4_,local_408.nestingLimit);
        local_6f8._40_4_ = (uint)local_408.ptr;
        local_6f8._44_4_ = local_408.ptr._4_4_;
        local_6f8._48_4_ = local_408.elementCount;
        local_6f8._52_4_ = local_408.step;
        local_6f8._24_4_ = (uint)local_408.segment;
        local_6f8._28_4_ = local_408.segment._4_4_;
        local_6f8._32_4_ = (uint)local_408.capTable;
        local_6f8._36_4_ = local_408.capTable._4_4_;
        local_6f8[0] = SUB81(this_00,0);
        local_6f8[1] = (undefined1)((ulong)this_00 >> 8);
        local_6f8._2_2_ = (undefined2)((ulong)this_00 >> 0x10);
        local_6f8._4_4_ = (undefined4)((ulong)this_00 >> 0x20);
        local_6f8._8_4_ = SUB84(this_00->errorReporter,0);
        local_6f8._12_4_ = (undefined4)((ulong)this_00->errorReporter >> 0x20);
        local_6f8._16_4_ = SUB84(pp_Var39,0);
        local_6f8._20_4_ = (undefined4)((ulong)pp_Var39 >> 0x20);
        aSStack_6b0[0]._vptr_StructOrGroup = (_func_int **)&PTR_addVoid_0028c0c0;
        aSStack_6b0[3]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_6b0[4]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_6b0[1]._vptr_StructOrGroup = (_func_int **)0x0;
        aSStack_6b0[2]._vptr_StructOrGroup = (_func_int **)0x0;
        kj::Arena::Arena(&local_688,0x400);
        psVar28 = local_2a8;
        local_668._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_668._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_668._M_impl.super__Rb_tree_header._M_header._M_left = local_2a0;
        local_668._M_impl.super__Rb_tree_header._M_header._M_right = local_2a0;
        local_2a8[2] = 0;
        psVar28[3] = 0;
        *psVar28 = 0;
        psVar28[1] = 0;
        local_620 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        if (cVar78 != '\0') {
          uVar51 = 0x7fffffff;
          local_8c8 = (SegmentBuilder *)0x0;
          pBVar81 = (BrandScope *)0x0;
          pSVar56 = (SegmentBuilder *)0x0;
        }
        BStack_610.body.tag = (uint)local_8c8;
        BStack_610.body._4_4_ = SUB84((ulong)local_8c8 >> 0x20,0);
        BStack_610.body.field_1._0_4_ = SUB84(pBVar81,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pBVar81 >> 0x20);
        local_618 = (undefined1  [8])pSVar56;
        BStack_610.body.field_1._8_4_ = uVar51;
        capnp::_::PointerReader::getList
                  (&local_3b8,(PointerReader *)local_618,INLINE_COMPOSITE,(word *)0x0);
        local_228 = local_750.segment;
        pSStack_220 = (SegmentBuilder *)local_750.capTable;
        local_218 = (BrandScope *)local_750.data;
        pSStack_210 = (SegmentBuilder *)local_750.pointers;
        local_208 = local_750.dataSize;
        SStack_204 = local_750.pointerCount;
        EStack_202 = local_750._38_1_;
        uStack_201 = local_750._39_1_;
        capnp::_::OrphanBuilder::asStruct(&local_180,&local_718,(StructSize)0x20002);
        puVar26 = local_2b0;
        local_2b0[4] = local_180._32_8_;
        pWVar53 = local_180.pointers;
        pCVar16 = local_180.capTable;
        pSVar56 = local_180.segment;
        puVar26[2] = local_180.data;
        puVar26[3] = pWVar53;
        *puVar26 = pSVar56;
        puVar26[1] = pCVar16;
        pSVar49 = pSStack_210;
        pBVar81 = local_218;
        pSVar64 = pSStack_220;
        pSVar56 = local_228;
        puVar26 = local_2b8;
        local_828._0_8_ = local_228;
        local_828._8_8_ = pSStack_220;
        local_828._16_8_ = local_218;
        local_828._24_8_ = pSStack_210;
        local_828._32_4_ = local_208;
        local_828._36_2_ = SStack_204;
        local_828[0x26] = EStack_202;
        local_828[0x27] = uStack_201;
        local_2b8[4] = _local_208;
        puVar26[2] = pBVar81;
        puVar26[3] = pSVar49;
        *puVar26 = pSVar56;
        puVar26[1] = pSVar64;
        ppWVar27 = local_2c0;
        local_618 = (undefined1  [8])0x0;
        BStack_610.body.tag = 0;
        BStack_610.body._4_4_ = 0;
        BStack_610.body.field_1._0_4_ = 0;
        BStack_610.body.field_1._4_4_ = 0;
        BStack_610.body.field_1._8_4_ = 0;
        BStack_610.body.field_1._12_4_ = BStack_610.body.field_1._12_4_ & 0xffffff00;
        BStack_610.body.field_1._16_4_ = 0x237f1b;
        BStack_610.body.field_1._20_2_ = 0;
        BStack_610.body.field_1._22_2_ = 0;
        BStack_610.body.field_1._24_4_ = 1;
        BStack_610.body.field_1._28_4_ = 0;
        BStack_610.body.field_1._64_6_ = 0;
        BStack_610.body.field_1._48_8_ = 0;
        BStack_610.body.field_1._56_6_ = 0;
        BStack_610.body.field_1._62_2_ = 0;
        BStack_610.body.field_1._32_4_ = 0;
        BStack_610.body.field_1._36_4_ = 0;
        BStack_610.body.field_1._40_4_ = 0;
        BStack_610.body.field_1._44_4_ = 0;
        BStack_610.body.field_1._72_4_ = 0x7fffffff;
        BStack_610.body.field_1._82_2_ = 0;
        BStack_610.source._reader.capTable._0_4_ = 0;
        BStack_610.source._reader.capTable._4_2_ = 0;
        BStack_610.brand.ptr = (BrandScope *)0x0;
        BStack_610.source._reader.segment._0_6_ = 0;
        BStack_610.source._reader.segment._6_2_ = 0;
        BStack_610.body.field_1._88_8_ = 0;
        BStack_610.brand.disposer = (Disposer *)0x0;
        BStack_610.source._reader.data._0_4_ = 0x7fffffff;
        *(undefined8 *)((long)local_2c0 + 0x1e) = 0;
        ppWVar27[2] = (WirePointer *)0x0;
        ppWVar27[3] = (WirePointer *)0x0;
        *ppWVar27 = (WirePointer *)0x0;
        ppWVar27[1] = (WirePointer *)0x0;
        puVar26 = local_2c8;
        local_558 = 0x7fffffff;
        *(undefined8 *)((long)local_2c8 + 0x1e) = 0;
        puVar26[2] = 0;
        puVar26[3] = 0;
        *puVar26 = 0;
        puVar26[1] = 0;
        puVar26 = local_2d0;
        local_52a = INLINE_COMPOSITE;
        local_528 = 0x7fffffff;
        local_500 = false;
        *(undefined1 *)(local_2d0 + 1) = 0;
        *puVar26 = 0;
        local_480.fieldScope = (StructOrGroup *)0x0;
        params_01.reader.step = local_3b8.step;
        params_01.reader.elementCount = local_3b8.elementCount;
        params_01.reader.capTable = local_3b8.capTable;
        params_01.reader.segment = local_3b8.segment;
        params_01.reader.ptr = local_3b8.ptr;
        params_01.reader.structDataSize = local_3b8.structDataSize;
        params_01.reader.structPointerCount = local_3b8.structPointerCount;
        params_01.reader.elementSize = local_3b8.elementSize;
        params_01.reader._39_1_ = local_3b8._39_1_;
        params_01.reader.nestingLimit = local_3b8.nestingLimit;
        params_01.reader._44_4_ = local_3b8._44_4_;
        StructTranslator::traverseParams
                  ((StructTranslator *)local_6f8,params_01,(MemberInfo *)local_618,aSStack_6b0);
        builder_01._builder.capTable = (CapTableBuilder *)local_828._8_8_;
        builder_01._builder.segment = (SegmentBuilder *)local_828._0_8_;
        builder_01._builder.data = (void *)local_828._16_8_;
        builder_01._builder.pointers = (WirePointer *)local_828._24_8_;
        builder_01._builder.dataSize = local_828._32_4_;
        builder_01._builder.pointerCount = local_828._36_2_;
        builder_01._builder._38_2_ = local_828._38_2_;
        StructTranslator::translateInternal
                  ((StructTranslator *)local_6f8,(MemberInfo *)local_618,builder_01);
        pppMVar25 = local_2e0;
        ppMVar21 = local_630;
        ppMVar20 = ppMStack_638;
        if (ppMStack_638 != (MemberInfo **)0x0) {
          *local_2e0 = (MemberInfo **)0x0;
          pppMVar25[1] = (MemberInfo **)0x0;
          pppMVar25[2] = (MemberInfo **)0x0;
          (**local_620->_vptr_ArrayDisposer)
                    (local_620,ppMVar20,8,(long)ppMVar21 - (long)ppMVar20 >> 3);
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
        ::~_Rb_tree(local_2d8);
        kj::Arena::~Arena(&local_688);
        pEVar59 = (ErrorReporter *)(((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer;
        BStack_610.body.field_1._0_4_ = SUB84(local_3d8.capTable,0);
        BStack_610.body.field_1._4_4_ = (undefined4)((ulong)local_3d8.capTable >> 0x20);
        BStack_610.body.field_1._8_4_ = SUB84(local_3d8.location,0);
        BStack_610.body.field_1._12_4_ = (undefined4)((ulong)local_3d8.location >> 0x20);
        local_618 = (undefined1  [8])local_3d8.tag.content;
        BStack_610.body.tag = (uint)local_3d8.segment;
        BStack_610.body._4_4_ = SUB84((ulong)local_3d8.segment >> 0x20,0);
        local_3d8.segment = (SegmentBuilder *)0x0;
        local_3d8.location = (word *)0x0;
        BStack_610.body.field_1._24_4_ = SUB84(local_718.segment,0);
        BStack_610.body.field_1._28_4_ = (undefined4)((ulong)local_718.segment >> 0x20);
        BStack_610.body.field_1._32_4_ = SUB84(local_718.capTable,0);
        BStack_610.body.field_1._36_4_ = (undefined4)((ulong)local_718.capTable >> 0x20);
        BStack_610.body.field_1._40_4_ = SUB84(local_718.location,0);
        BStack_610.body.field_1._44_4_ = (undefined4)((ulong)local_718.location >> 0x20);
        BStack_610.body.field_1._16_4_ = (undefined4)local_718.tag.content;
        BStack_610.body.field_1._20_2_ = (undefined2)(local_718.tag.content >> 0x20);
        BStack_610.body.field_1._22_2_ = (undefined2)(local_718.tag.content >> 0x30);
        local_718.segment = (SegmentBuilder *)0x0;
        local_718.location = (word *)0x0;
        pAVar4 = (this_00->paramStructs).builder.endPtr;
        if ((this_00->paramStructs).builder.pos == pAVar4) {
          sVar61 = (long)pAVar4 - (long)*(AuxNode **)&local_2f8->body >> 5;
          if (pAVar4 == *(AuxNode **)&local_2f8->body) {
            sVar61 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::setCapacity
                    ((Vector<capnp::compiler::NodeTranslator::AuxNode> *)local_2f8,sVar61);
        }
        pRVar5 = (this_00->paramStructs).builder.pos;
        (pRVar5->node).builder.segment =
             (SegmentBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
        (pRVar5->node).builder.capTable =
             (CapTableBuilder *)
             CONCAT44(BStack_610.body.field_1._4_4_,BStack_610.body.field_1._0_4_);
        (pRVar5->node).builder.location =
             (word *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
        (pRVar5->node).builder.tag.content = (uint64_t)local_618;
        BStack_610.body.tag = 0;
        BStack_610.body._4_4_ = 0;
        BStack_610.body.field_1._8_4_ = 0;
        BStack_610.body.field_1._12_4_ = 0;
        (pRVar5->sourceInfo).builder.segment =
             (SegmentBuilder *)
             CONCAT44(BStack_610.body.field_1._28_4_,BStack_610.body.field_1._24_4_);
        (pRVar5->sourceInfo).builder.capTable =
             (CapTableBuilder *)
             CONCAT44(BStack_610.body.field_1._36_4_,BStack_610.body.field_1._32_4_);
        (pRVar5->sourceInfo).builder.location =
             (word *)CONCAT44(BStack_610.body.field_1._44_4_,BStack_610.body.field_1._40_4_);
        (pRVar5->sourceInfo).builder.tag.content =
             CONCAT26(BStack_610.body.field_1._22_2_,
                      CONCAT24(BStack_610.body.field_1._20_2_,BStack_610.body.field_1._16_4_));
        BStack_610.body.field_1._24_4_ = 0;
        BStack_610.body.field_1._28_4_ = 0;
        BStack_610.body.field_1._40_4_ = 0;
        BStack_610.body.field_1._44_4_ = 0;
        ppRVar2 = &(this_00->paramStructs).builder.pos;
        *ppRVar2 = *ppRVar2 + 1;
        BrandScope::push((BrandScope *)local_760,(uint64_t)(this_00->localBrand).ptr,
                         (uint)(((Refcounted *)local_750.data)->super_Disposer)._vptr_Disposer);
        if ((ulong)local_408.elementCount != 0) {
          pSStack_890 = (SegmentBuilder *)
                        kj::_::HeapArrayDisposer::allocateImpl
                                  (0xa8,0,(ulong)local_408.elementCount,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
          pBStack_880 = (BrandScope *)&kj::_::HeapArrayDisposer::instance;
          BStack_610.body.field_1._0_8_ = (long)local_750.pointers + 0x28;
          local_618 = (undefined1  [8])local_750.segment;
          BStack_610.body.tag = (uint)local_750.capTable;
          BStack_610.body._4_4_ = SUB84((ulong)local_750.capTable >> 0x20,0);
          pSVar56 = pSStack_890;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_6f8,(PointerBuilder *)local_618,local_408.elementCount,
                     (StructSize)0x10000);
          uVar58 = (ulong)local_408.elementCount;
          if (uVar58 != 0) {
            uVar69 = 0;
            do {
              EVar72 = (ElementCount)uVar69;
              capnp::_::ListReader::getStructElement((StructReader *)local_618,&local_408,EVar72);
              *(undefined4 *)&(pSStack_890->super_SegmentReader).arena = 2;
              *(undefined8 *)&(pSStack_890->super_SegmentReader).id = 0;
              *(ElementCount *)&(pSStack_890->super_SegmentReader).ptr.ptr = EVar72;
              *(undefined8 *)&pSStack_890[1].readOnly = 0;
              pSStack_890[2].super_SegmentReader.arena = (Arena *)0x0;
              *(undefined8 *)&pSStack_890[2].super_SegmentReader.id = 0;
              pSStack_890[2].super_SegmentReader.ptr.ptr = (word *)0x0;
              pSStack_890[2].super_SegmentReader.ptr.size_ = 0;
              pSStack_890[2].super_SegmentReader.readLimiter = (ReadLimiter *)0x0;
              pSStack_890[2].pos = (word *)0x0;
              *(undefined8 *)&pSStack_890[2].readOnly = 0x7fffffff;
              pSStack_890 = pSStack_890 + 3;
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_828,(ListBuilder *)local_6f8,EVar72);
              if (BStack_610.body.field_1._20_2_ == 0) {
                local_788.elementCount = 0x7fffffff;
                local_788.capTable = (CapTableBuilder *)0x0;
                local_788.ptr = (byte *)0x0;
                local_788.segment = (SegmentBuilder *)0x0;
              }
              else {
                local_788.capTable =
                     (CapTableBuilder *)CONCAT44(BStack_610.body._4_4_,BStack_610.body.tag);
                local_788.ptr =
                     (byte *)CONCAT44(BStack_610.body.field_1._12_4_,BStack_610.body.field_1._8_4_);
                local_788.segment = (SegmentBuilder *)local_618;
                local_788.elementCount = BStack_610.body.field_1._24_4_;
              }
              RVar74 = capnp::_::PointerReader::getBlob<capnp::Text>
                                 ((PointerReader *)&local_788,(void *)0x0,0);
              local_788.segment = (SegmentBuilder *)local_828._0_8_;
              local_788.capTable = (CapTableBuilder *)local_828._8_8_;
              local_788.ptr = (byte *)local_828._24_8_;
              capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_788,RVar74);
              uVar69 = uVar69 + 1;
            } while (uVar58 != uVar69);
          }
          pSStack_470 = (SegmentBuilder *)
                        (((long)pSStack_890 - (long)pSVar56 >> 3) * -0x30c30c30c30c30c3);
          local_468 = &kj::_::HeapArrayDisposer::instance;
          pSVar64 = (SegmentBuilder *)0x0;
          pSStack_890 = (SegmentBuilder *)0x0;
          local_888 = (BrandScope *)0x0;
          BStack_610.body.field_1._16_4_ = 0;
          BStack_610.body.field_1._20_2_ = 0;
          BStack_610.body.field_1._22_2_ = 0;
          BStack_610.body.field_1._28_4_ = 0;
          local_618 = (undefined1  [8])0x0;
          BStack_610.body.tag = 0;
          BStack_610.body._4_4_ = 0;
          BStack_610.body.field_1._0_4_ = 0;
          BStack_610.body.field_1._4_4_ = 0;
          BStack_610.body.field_1._8_4_ = 0;
          BStack_610.body.field_1._12_4_ = 0;
          BStack_610.body.field_1._24_4_ = 0x7fffffff;
          auVar11 = ZEXT1640(ZEXT816(0)) << 0x40;
          source_03._reader._40_8_ = 0x7fffffff;
          source_03._reader.segment = (SegmentReader *)auVar11._0_8_;
          source_03._reader.capTable = (CapTableReader *)auVar11._8_8_;
          source_03._reader.data = (void *)auVar11._16_8_;
          source_03._reader.pointers = (WirePointer *)auVar11._24_8_;
          source_03._reader.dataSize = auVar11._32_4_;
          source_03._reader.pointerCount = auVar11._36_2_;
          source_03._reader._38_2_ = auVar11._38_2_;
          local_478 = pSVar56;
          BrandScope::setParams
                    ((BrandScope *)local_330,(Array<capnp::compiler::BrandedDecl> *)local_758,
                     (Which)&local_478,source_03);
          plVar24 = local_328;
          if (local_328 != (long *)0x0) {
            local_328 = (long *)0x0;
            (**(code **)*(_func_int **)local_330)
                      (local_330,(long)plVar24 + *(long *)(*plVar24 + -0x10));
          }
          pSVar49 = pSStack_470;
          pSVar56 = local_478;
          if (local_478 != (SegmentBuilder *)0x0) {
            local_478 = (SegmentBuilder *)0x0;
            pSStack_470 = (SegmentBuilder *)0x0;
            (**(code **)*local_468)(local_468,pSVar56,0xa8,pSVar49,pSVar49);
          }
          in_stack_fffffffffffff768 = pSVar64;
          if (pSVar64 != (SegmentBuilder *)0x0) {
            in_stack_fffffffffffff768 = (SegmentBuilder *)0x0;
            pSStack_890 = (SegmentBuilder *)0x0;
            local_888 = (BrandScope *)0x0;
            kj::_::HeapArrayDisposer::disposeImpl
                      ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pSVar64,0xa8,
                       (-(long)pSVar64 >> 3) * -0x30c30c30c30c30c3,
                       (-(long)pSVar64 >> 3) * -0x30c30c30c30c30c3,
                       kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
          }
        }
        local_7c8.builder.ptr = (BrandScope **)0x0;
        local_7c8.builder.pos = (BrandScope **)0x0;
        local_7c8.builder.endPtr = (BrandScope **)0x0;
        local_7c8.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        uVar77 = SUB81(local_758,0);
        uVar79 = (undefined1)((ulong)local_758 >> 8);
        in_stack_fffffffffffff742 = (undefined6)((ulong)local_758 >> 0x10);
        pBVar81 = local_758;
        do {
          if (((pBVar81->params).size_ != 0) ||
             ((pBVar81->inherited == true && (pBVar81->leafParamCount != 0)))) {
            if (local_7c8.builder.pos == local_7c8.builder.endPtr) {
              sVar61 = (long)local_7c8.builder.endPtr - (long)local_7c8.builder.ptr >> 2;
              if (local_7c8.builder.endPtr == local_7c8.builder.ptr) {
                sVar61 = 4;
              }
              kj::Vector<capnp::compiler::BrandScope_*>::setCapacity(&local_7c8,sVar61);
            }
            *local_7c8.builder.pos = pBVar81;
            local_7c8.builder.pos = local_7c8.builder.pos + 1;
          }
          pBVar81 = (pBVar81->parent).ptr.ptr;
        } while (pBVar81 != (BrandScope *)0x0);
        if (local_7c8.builder.pos != local_7c8.builder.ptr) {
          local_788.ptr = (byte *)(local_320.pointers + 3);
          local_788.segment = local_320.segment;
          local_788.capTable = local_320.capTable;
          capnp::_::PointerBuilder::initStruct
                    ((StructBuilder *)local_828,(PointerBuilder *)&local_788,(StructSize)0x10000);
          local_788.segment = (SegmentBuilder *)local_828._0_8_;
          local_788.capTable = (CapTableBuilder *)local_828._8_8_;
          local_788.ptr = (byte *)local_828._24_8_;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_6f8,(PointerBuilder *)&local_788,
                     (ElementCount)
                     ((ulong)((long)local_7c8.builder.pos - (long)local_7c8.builder.ptr) >> 3),
                     (StructSize)0x10002);
          lVar45 = (long)local_7c8.builder.pos - (long)local_7c8.builder.ptr;
          if (lVar45 != 0) {
            uVar58 = lVar45 >> 3;
            uVar69 = 0;
            uVar34 = (undefined4)uVar58;
            iVar36 = (int)(lVar45 >> 0x23);
            do {
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_828,(ListBuilder *)local_6f8,(ElementCount)uVar69);
              uVar68 = uVar69 & 0xffffffff;
              pBVar81 = local_7c8.builder.ptr[uVar68];
              (((Refcounted *)local_828._16_8_)->super_Disposer)._vptr_Disposer =
                   (_func_int **)pBVar81->leafId;
              if (pBVar81->inherited == true) {
                *(undefined2 *)&((Refcounted *)local_828._16_8_)->refcount = 1;
              }
              else {
                sVar61 = (local_7c8.builder.ptr[uVar68]->params).size_;
                *(undefined2 *)&((Refcounted *)local_828._16_8_)->refcount = 0;
                local_7f8.segment = (SegmentBuilder *)local_828._0_8_;
                local_7f8.capTable = (CapTableBuilder *)local_828._8_8_;
                local_7f8.data = (void *)local_828._24_8_;
                capnp::_::PointerBuilder::initStructList
                          (&local_788,(PointerBuilder *)&local_7f8,(ElementCount)sVar61,
                           (StructSize)0x10001);
                uVar58 = (ulong)local_788.elementCount;
                if (uVar58 != 0) {
                  lVar45 = 0;
                  uVar71 = 0;
                  do {
                    pBVar7 = (local_7c8.builder.ptr[uVar68]->params).ptr;
                    errorReporter =
                         *(ErrorReporter **)
                          (CONCAT62(in_stack_fffffffffffff742,CONCAT11(uVar79,uVar77)) + 0x10);
                    capnp::_::ListBuilder::getStructElement
                              (&local_7f8,&local_788,(ElementCount)uVar71);
                    *(undefined2 *)&((SegmentReader *)local_7f8.data)->arena = 1;
                    local_1c8.segment = local_7f8.segment;
                    local_1c8.capTable = local_7f8.capTable;
                    local_1c8.pointer = local_7f8.pointers;
                    capnp::_::PointerBuilder::initStruct
                              ((StructBuilder *)&stack0xfffffffffffff768,&local_1c8,
                               (StructSize)0x10003);
                    target_03._builder.capTable = (CapTableBuilder *)pSStack_890;
                    target_03._builder.segment = in_stack_fffffffffffff768;
                    target_03._builder.data = local_888;
                    target_03._builder.pointers = (WirePointer *)pBStack_880;
                    target_03._builder._32_8_ = local_878;
                    BrandedDecl::compileAsType
                              ((BrandedDecl *)((long)&(pBVar7->body).tag + lVar45),errorReporter,
                               target_03);
                    uVar71 = uVar71 + 1;
                    lVar45 = lVar45 + 0xa8;
                  } while (uVar58 != uVar71);
                }
                uVar58 = CONCAT44(iVar36,uVar34);
              }
              uVar69 = uVar69 + 1;
              this_00 = local_720;
            } while (uVar69 != uVar58);
          }
        }
        ppBVar19 = local_7c8.builder.endPtr;
        ppBVar18 = local_7c8.builder.pos;
        ppBVar17 = local_7c8.builder.ptr;
        if (local_7c8.builder.ptr != (BrandScope **)0x0) {
          local_7c8.builder.ptr = (BrandScope **)0x0;
          local_7c8.builder.pos = (BrandScope **)0x0;
          local_7c8.builder.endPtr = (BrandScope **)0x0;
          (**(local_7c8.builder.disposer)->_vptr_ArrayDisposer)
                    (local_7c8.builder.disposer,ppBVar17,8,(long)ppBVar18 - (long)ppBVar17 >> 3,
                     (long)ppBVar19 - (long)ppBVar17 >> 3);
        }
        pBVar81 = local_758;
        if (local_758 != (BrandScope *)0x0) {
          local_758 = (BrandScope *)0x0;
          (**(code **)*(_func_int **)local_760)
                    (local_760,
                     (long)&(pBVar81->super_Refcounted).super_Disposer._vptr_Disposer +
                     *(long *)&((BrandedDecl *)
                               (pBVar81->super_Refcounted).super_Disposer._vptr_Disposer)[-1].source
                               ._reader.dataSize);
        }
        sVar61 = local_458.content.size_;
        pcVar63 = local_458.content.ptr;
        if ((SegmentBuilder *)local_458.content.ptr != (SegmentBuilder *)0x0) {
          local_458.content.ptr = (char *)0x0;
          local_458.content.size_ = 0;
          (**(local_458.content.disposer)->_vptr_ArrayDisposer)
                    (local_458.content.disposer,pcVar63,1,sVar61,sVar61);
        }
        if (local_718.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_718);
        }
        if (local_3d8.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_3d8);
        }
      }
LAB_00169532:
      p_Var29 = local_290;
      *(ErrorReporter **)((long)local_320.data + 0x10) = pEVar59;
      if ((ushort)local_790 < 4) {
        BStack_610.body.field_1._8_4_ = 0x7fffffff;
        p_Var50 = (_Base_ptr)0x0;
        pp_Var37 = (_Base_ptr *)0x0;
        local_618 = (undefined1  [8])0x0;
      }
      else {
        pp_Var37 = &local_830->_M_right;
        local_618 = (undefined1  [8])local_798;
        BStack_610.body.field_1._8_4_ = (ListElementCount)local_7a0;
      }
      BStack_610.body.tag = (uint)p_Var50;
      BStack_610.body._4_4_ = SUB84((ulong)p_Var50 >> 0x20,0);
      BStack_610.body.field_1._0_4_ = SUB84(pp_Var37,0);
      BStack_610.body.field_1._4_4_ = (undefined4)((ulong)pp_Var37 >> 0x20);
      capnp::_::PointerReader::getList
                (&local_130,(PointerReader *)local_618,INLINE_COMPOSITE,(word *)0x0);
      annotations.reader.capTable = local_130.capTable;
      annotations.reader.segment = local_130.segment;
      annotations.reader.ptr = local_130.ptr;
      annotations.reader.elementCount = local_130.elementCount;
      annotations.reader.step = local_130.step;
      annotations.reader.structDataSize = local_130.structDataSize;
      annotations.reader.structPointerCount = local_130.structPointerCount;
      annotations.reader.elementSize = local_130.elementSize;
      annotations.reader._39_1_ = local_130._39_1_;
      annotations.reader.nestingLimit = local_130.nestingLimit;
      annotations.reader._44_4_ = local_130._44_4_;
      targetsFlagName.content.size_ = 0xe;
      targetsFlagName.content.ptr = "targetsMethod";
      compileAnnotationApplications
                ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)local_6f8,
                 this_00,annotations,targetsFlagName);
      BStack_610.body.field_1._0_8_ = local_320.pointers + 1;
      local_618 = (undefined1  [8])local_320.segment;
      BStack_610.body.tag = (uint)local_320.capTable;
      BStack_610.body._4_4_ = SUB84((ulong)local_320.capTable >> 0x20,0);
      capnp::_::PointerBuilder::adopt((PointerBuilder *)local_618,(OrphanBuilder *)local_6f8);
      if (CONCAT44(local_6f8._12_4_,local_6f8._8_4_) != 0) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)local_6f8);
      }
      local_724 = local_724 + 1;
      p_Var41 = (_Base_ptr)std::_Rb_tree_increment(p_Var29);
      p_Var40 = (_Base_ptr)((ulong)uVar80 << 0x20);
    } while (p_Var41 != &_Stack_280);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
               *)local_288);
  return;
}

Assistant:

void NodeTranslator::compileInterface(Declaration::Interface::Reader decl,
                                      List<Declaration>::Reader members,
                                      schema::Node::Builder builder) {
  auto interfaceBuilder = builder.initInterface();

  auto superclassesDecl = decl.getSuperclasses();
  auto superclassesBuilder = interfaceBuilder.initSuperclasses(superclassesDecl.size());
  for (uint i: kj::indices(superclassesDecl)) {
    auto superclass = superclassesDecl[i];

    KJ_IF_SOME(decl, compileDeclExpression(superclass, ImplicitParams::none())) {
      KJ_IF_SOME(kind, decl.getKind()) {
        if (kind == Declaration::INTERFACE) {
          auto s = superclassesBuilder[i];
          s.setId(decl.getIdAndFillBrand([&]() { return s.initBrand(); }));
        } else {
          decl.addError(errorReporter, kj::str(
            "'", decl.toString(), "' is not an interface."));
        }
      } else {
        // A variable?
        decl.addError(errorReporter, kj::str(
            "'", decl.toString(), "' is an unbound generic parameter. Currently we don't support "
            "extending these."));
      }
    }
  }